

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [60];
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  long lVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined8 in_R10;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar84 [16];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  undefined1 auVar124 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [64];
  float t1;
  undefined4 uVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar155;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vfloat4 b0;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  vfloat4 b0_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  vfloat4 a0_2;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar227;
  float fVar228;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar229;
  float fVar240;
  float fVar241;
  vfloat4 a0_1;
  undefined1 auVar230 [16];
  float fVar242;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar248;
  float fVar249;
  vfloat4 a0;
  undefined1 auVar244 [16];
  float fVar250;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_620;
  uint auStack_5f0 [4];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar55;
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar123 [64];
  undefined1 auVar125 [64];
  undefined1 auVar254 [32];
  
  uVar54 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar54 * 0x19 + 0x12);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar66 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar68 = vsubps_avx(auVar65,*(undefined1 (*) [16])(prim + uVar54 * 0x19 + 6));
  fVar147 = fVar1 * auVar68._0_4_;
  fVar129 = fVar1 * auVar66._0_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar54 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar65);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar54 * 5 + 6);
  auVar97 = vpmovsxbd_avx2(auVar73);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar54 * 6 + 6);
  auVar98 = vpmovsxbd_avx2(auVar72);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar54 * 0xb + 6);
  auVar109 = vpmovsxbd_avx2(auVar71);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar54 * 0xc + 6);
  auVar110 = vpmovsxbd_avx2(auVar74);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar54 * 0xd + 6);
  auVar100 = vpmovsxbd_avx2(auVar4);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar54 * 0x12 + 6);
  auVar101 = vpmovsxbd_avx2(auVar70);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar54 * 0x13 + 6);
  auVar104 = vpmovsxbd_avx2(auVar69);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar54 * 0x14 + 6);
  auVar95 = vpmovsxbd_avx2(auVar5);
  auVar102 = vcvtdq2ps_avx(auVar104);
  auVar103 = vcvtdq2ps_avx(auVar95);
  auVar159._4_4_ = fVar129;
  auVar159._0_4_ = fVar129;
  auVar159._8_4_ = fVar129;
  auVar159._12_4_ = fVar129;
  auVar159._16_4_ = fVar129;
  auVar159._20_4_ = fVar129;
  auVar159._24_4_ = fVar129;
  auVar159._28_4_ = fVar129;
  auVar260._8_4_ = 1;
  auVar260._0_8_ = 0x100000001;
  auVar260._12_4_ = 1;
  auVar260._16_4_ = 1;
  auVar260._20_4_ = 1;
  auVar260._24_4_ = 1;
  auVar260._28_4_ = 1;
  auVar105 = ZEXT1632(CONCAT412(fVar1 * auVar66._12_4_,
                                CONCAT48(fVar1 * auVar66._8_4_,
                                         CONCAT44(fVar1 * auVar66._4_4_,fVar129))));
  auVar96 = vpermps_avx2(auVar260,auVar105);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar267 = ZEXT3264(auVar93);
  auVar94 = vpermps_avx512vl(auVar93,auVar105);
  fVar129 = auVar94._0_4_;
  fVar218 = auVar94._4_4_;
  auVar105._4_4_ = fVar218 * auVar98._4_4_;
  auVar105._0_4_ = fVar129 * auVar98._0_4_;
  fVar227 = auVar94._8_4_;
  auVar105._8_4_ = fVar227 * auVar98._8_4_;
  fVar228 = auVar94._12_4_;
  auVar105._12_4_ = fVar228 * auVar98._12_4_;
  fVar135 = auVar94._16_4_;
  auVar105._16_4_ = fVar135 * auVar98._16_4_;
  fVar136 = auVar94._20_4_;
  auVar105._20_4_ = fVar136 * auVar98._20_4_;
  fVar137 = auVar94._24_4_;
  auVar105._24_4_ = fVar137 * auVar98._24_4_;
  auVar105._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar100._4_4_ * fVar218;
  auVar95._0_4_ = auVar100._0_4_ * fVar129;
  auVar95._8_4_ = auVar100._8_4_ * fVar227;
  auVar95._12_4_ = auVar100._12_4_ * fVar228;
  auVar95._16_4_ = auVar100._16_4_ * fVar135;
  auVar95._20_4_ = auVar100._20_4_ * fVar136;
  auVar95._24_4_ = auVar100._24_4_ * fVar137;
  auVar95._28_4_ = auVar104._28_4_;
  auVar104._4_4_ = auVar103._4_4_ * fVar218;
  auVar104._0_4_ = auVar103._0_4_ * fVar129;
  auVar104._8_4_ = auVar103._8_4_ * fVar227;
  auVar104._12_4_ = auVar103._12_4_ * fVar228;
  auVar104._16_4_ = auVar103._16_4_ * fVar135;
  auVar104._20_4_ = auVar103._20_4_ * fVar136;
  auVar104._24_4_ = auVar103._24_4_ * fVar137;
  auVar104._28_4_ = auVar94._28_4_;
  auVar65 = vfmadd231ps_fma(auVar105,auVar96,auVar97);
  auVar73 = vfmadd231ps_fma(auVar95,auVar96,auVar110);
  auVar72 = vfmadd231ps_fma(auVar104,auVar102,auVar96);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar159,auVar99);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar159,auVar109);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar101,auVar159);
  auVar170._4_4_ = fVar147;
  auVar170._0_4_ = fVar147;
  auVar170._8_4_ = fVar147;
  auVar170._12_4_ = fVar147;
  auVar170._16_4_ = fVar147;
  auVar170._20_4_ = fVar147;
  auVar170._24_4_ = fVar147;
  auVar170._28_4_ = fVar147;
  auVar95 = ZEXT1632(CONCAT412(fVar1 * auVar68._12_4_,
                               CONCAT48(fVar1 * auVar68._8_4_,
                                        CONCAT44(fVar1 * auVar68._4_4_,fVar147))));
  auVar104 = vpermps_avx2(auVar260,auVar95);
  auVar95 = vpermps_avx512vl(auVar93,auVar95);
  auVar96 = vmulps_avx512vl(auVar95,auVar98);
  auVar107._0_4_ = auVar95._0_4_ * auVar100._0_4_;
  auVar107._4_4_ = auVar95._4_4_ * auVar100._4_4_;
  auVar107._8_4_ = auVar95._8_4_ * auVar100._8_4_;
  auVar107._12_4_ = auVar95._12_4_ * auVar100._12_4_;
  auVar107._16_4_ = auVar95._16_4_ * auVar100._16_4_;
  auVar107._20_4_ = auVar95._20_4_ * auVar100._20_4_;
  auVar107._24_4_ = auVar95._24_4_ * auVar100._24_4_;
  auVar107._28_4_ = 0;
  auVar100._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar100._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar100._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar100._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar100._16_4_ = auVar95._16_4_ * auVar103._16_4_;
  auVar100._20_4_ = auVar95._20_4_ * auVar103._20_4_;
  auVar100._24_4_ = auVar95._24_4_ * auVar103._24_4_;
  auVar100._28_4_ = auVar98._28_4_;
  auVar97 = vfmadd231ps_avx512vl(auVar96,auVar104,auVar97);
  auVar71 = vfmadd231ps_fma(auVar107,auVar104,auVar110);
  auVar74 = vfmadd231ps_fma(auVar100,auVar104,auVar102);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar170,auVar99);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar170,auVar109);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar170,auVar101);
  auVar111._8_4_ = 0x7fffffff;
  auVar111._0_8_ = 0x7fffffff7fffffff;
  auVar111._12_4_ = 0x7fffffff;
  auVar111._16_4_ = 0x7fffffff;
  auVar111._20_4_ = 0x7fffffff;
  auVar111._24_4_ = 0x7fffffff;
  auVar111._28_4_ = 0x7fffffff;
  auVar99 = vandps_avx(ZEXT1632(auVar65),auVar111);
  auVar113._8_4_ = 0x219392ef;
  auVar113._0_8_ = 0x219392ef219392ef;
  auVar113._12_4_ = 0x219392ef;
  auVar113._16_4_ = 0x219392ef;
  auVar113._20_4_ = 0x219392ef;
  auVar113._24_4_ = 0x219392ef;
  auVar113._28_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar99,auVar113,1);
  bVar63 = (bool)((byte)uVar59 & 1);
  auVar96._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar65._0_4_;
  bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar65._4_4_;
  bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar65._8_4_;
  bVar63 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar65._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar73),auVar111);
  uVar59 = vcmpps_avx512vl(auVar99,auVar113,1);
  bVar63 = (bool)((byte)uVar59 & 1);
  auVar93._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._0_4_;
  bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._4_4_;
  bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._8_4_;
  bVar63 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar72),auVar111);
  uVar59 = vcmpps_avx512vl(auVar99,auVar113,1);
  bVar63 = (bool)((byte)uVar59 & 1);
  auVar99._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar72._0_4_;
  bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar72._4_4_;
  bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar72._8_4_;
  bVar63 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar72._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar96);
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = 0x3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar65 = vfnmadd213ps_fma(auVar96,auVar98,auVar112);
  auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar93);
  auVar73 = vfnmadd213ps_fma(auVar93,auVar98,auVar112);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar99);
  auVar72 = vfnmadd213ps_fma(auVar99,auVar98,auVar112);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar98,auVar98);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 7 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx512vl(auVar99,auVar97);
  auVar101._4_4_ = auVar65._4_4_ * auVar99._4_4_;
  auVar101._0_4_ = auVar65._0_4_ * auVar99._0_4_;
  auVar101._8_4_ = auVar65._8_4_ * auVar99._8_4_;
  auVar101._12_4_ = auVar65._12_4_ * auVar99._12_4_;
  auVar101._16_4_ = auVar99._16_4_ * 0.0;
  auVar101._20_4_ = auVar99._20_4_ * 0.0;
  auVar101._24_4_ = auVar99._24_4_ * 0.0;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 9 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx512vl(auVar99,auVar97);
  auVar108._0_4_ = auVar65._0_4_ * auVar99._0_4_;
  auVar108._4_4_ = auVar65._4_4_ * auVar99._4_4_;
  auVar108._8_4_ = auVar65._8_4_ * auVar99._8_4_;
  auVar108._12_4_ = auVar65._12_4_ * auVar99._12_4_;
  auVar108._16_4_ = auVar99._16_4_ * 0.0;
  auVar108._20_4_ = auVar99._20_4_ * 0.0;
  auVar108._24_4_ = auVar99._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 0xe + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar71));
  auVar102._4_4_ = auVar73._4_4_ * auVar99._4_4_;
  auVar102._0_4_ = auVar73._0_4_ * auVar99._0_4_;
  auVar102._8_4_ = auVar73._8_4_ * auVar99._8_4_;
  auVar102._12_4_ = auVar73._12_4_ * auVar99._12_4_;
  auVar102._16_4_ = auVar99._16_4_ * 0.0;
  auVar102._20_4_ = auVar99._20_4_ * 0.0;
  auVar102._24_4_ = auVar99._24_4_ * 0.0;
  auVar102._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar71));
  auVar106._0_4_ = auVar73._0_4_ * auVar99._0_4_;
  auVar106._4_4_ = auVar73._4_4_ * auVar99._4_4_;
  auVar106._8_4_ = auVar73._8_4_ * auVar99._8_4_;
  auVar106._12_4_ = auVar73._12_4_ * auVar99._12_4_;
  auVar106._16_4_ = auVar99._16_4_ * 0.0;
  auVar106._20_4_ = auVar99._20_4_ * 0.0;
  auVar106._24_4_ = auVar99._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 0x15 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar74));
  auVar103._4_4_ = auVar99._4_4_ * auVar72._4_4_;
  auVar103._0_4_ = auVar99._0_4_ * auVar72._0_4_;
  auVar103._8_4_ = auVar99._8_4_ * auVar72._8_4_;
  auVar103._12_4_ = auVar99._12_4_ * auVar72._12_4_;
  auVar103._16_4_ = auVar99._16_4_ * 0.0;
  auVar103._20_4_ = auVar99._20_4_ * 0.0;
  auVar103._24_4_ = auVar99._24_4_ * 0.0;
  auVar103._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 0x17 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar74));
  auVar94._0_4_ = auVar72._0_4_ * auVar99._0_4_;
  auVar94._4_4_ = auVar72._4_4_ * auVar99._4_4_;
  auVar94._8_4_ = auVar72._8_4_ * auVar99._8_4_;
  auVar94._12_4_ = auVar72._12_4_ * auVar99._12_4_;
  auVar94._16_4_ = auVar99._16_4_ * 0.0;
  auVar94._20_4_ = auVar99._20_4_ * 0.0;
  auVar94._24_4_ = auVar99._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar101,auVar108);
  auVar97 = vpminsd_avx2(auVar102,auVar106);
  auVar99 = vmaxps_avx(auVar99,auVar97);
  auVar97 = vpminsd_avx2(auVar103,auVar94);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar98._4_4_ = uVar138;
  auVar98._0_4_ = uVar138;
  auVar98._8_4_ = uVar138;
  auVar98._12_4_ = uVar138;
  auVar98._16_4_ = uVar138;
  auVar98._20_4_ = uVar138;
  auVar98._24_4_ = uVar138;
  auVar98._28_4_ = uVar138;
  auVar97 = vmaxps_avx512vl(auVar97,auVar98);
  auVar99 = vmaxps_avx(auVar99,auVar97);
  auVar97._8_4_ = 0x3f7ffffa;
  auVar97._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar97._12_4_ = 0x3f7ffffa;
  auVar97._16_4_ = 0x3f7ffffa;
  auVar97._20_4_ = 0x3f7ffffa;
  auVar97._24_4_ = 0x3f7ffffa;
  auVar97._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar99,auVar97);
  auVar99 = vpmaxsd_avx2(auVar101,auVar108);
  auVar97 = vpmaxsd_avx2(auVar102,auVar106);
  auVar99 = vminps_avx(auVar99,auVar97);
  auVar97 = vpmaxsd_avx2(auVar103,auVar94);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar109._4_4_ = uVar138;
  auVar109._0_4_ = uVar138;
  auVar109._8_4_ = uVar138;
  auVar109._12_4_ = uVar138;
  auVar109._16_4_ = uVar138;
  auVar109._20_4_ = uVar138;
  auVar109._24_4_ = uVar138;
  auVar109._28_4_ = uVar138;
  auVar97 = vminps_avx512vl(auVar97,auVar109);
  auVar99 = vminps_avx(auVar99,auVar97);
  auVar110._8_4_ = 0x3f800003;
  auVar110._0_8_ = 0x3f8000033f800003;
  auVar110._12_4_ = 0x3f800003;
  auVar110._16_4_ = 0x3f800003;
  auVar110._20_4_ = 0x3f800003;
  auVar110._24_4_ = 0x3f800003;
  auVar110._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar110);
  auVar97 = vpbroadcastd_avx512vl();
  uVar24 = vcmpps_avx512vl(local_3c0,auVar99,2);
  uVar25 = vpcmpgtd_avx512vl(auVar97,_DAT_01fb4ba0);
  uVar59 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar24 & (byte)uVar25));
  auVar134 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar134);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar134 = ZEXT1664(auVar65);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar261 = ZEXT1664(auVar65);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar262 = ZEXT1664(auVar65);
  auVar270 = ZEXT464(0x3f800000);
LAB_019c9da5:
  if (uVar59 == 0) {
    return;
  }
  lVar56 = 0;
  for (uVar54 = uVar59; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar56 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar6].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar7);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar65 = *(undefined1 (*) [16])(_Var12 + uVar54 * (long)pvVar11);
  auVar73 = *(undefined1 (*) [16])(_Var12 + (uVar54 + 1) * (long)pvVar11);
  auVar72 = *(undefined1 (*) [16])(_Var12 + (uVar54 + 2) * (long)pvVar11);
  auVar71 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar54 + 3));
  lVar56 = *(long *)&pGVar9[1].time_range.upper;
  auVar74 = *(undefined1 (*) [16])(lVar56 + (long)p_Var10 * uVar54);
  auVar4 = *(undefined1 (*) [16])(lVar56 + (long)p_Var10 * (uVar54 + 1));
  auVar70 = *(undefined1 (*) [16])(lVar56 + (long)p_Var10 * (uVar54 + 2));
  uVar59 = uVar59 - 1 & uVar59;
  auVar69 = *(undefined1 (*) [16])(lVar56 + (long)p_Var10 * (uVar54 + 3));
  if (uVar59 != 0) {
    uVar60 = uVar59 - 1 & uVar59;
    for (uVar54 = uVar59; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar60 != 0) {
      for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar1 = *(float *)(ray + k * 4 + 0xc0);
  auVar139 = ZEXT816(0) << 0x40;
  auVar68._0_4_ = auVar69._0_4_ * 0.0;
  auVar68._4_4_ = auVar69._4_4_ * 0.0;
  auVar68._8_4_ = auVar69._8_4_ * 0.0;
  auVar68._12_4_ = auVar69._12_4_ * 0.0;
  auVar68 = vfmadd231ps_fma(auVar68,auVar70,auVar139);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar68);
  auVar78._0_4_ = auVar74._0_4_ + auVar66._0_4_;
  auVar78._4_4_ = auVar74._4_4_ + auVar66._4_4_;
  auVar78._8_4_ = auVar74._8_4_ + auVar66._8_4_;
  auVar78._12_4_ = auVar74._12_4_ + auVar66._12_4_;
  auVar140 = auVar134._0_16_;
  auVar66 = vfmadd231ps_avx512vl(auVar68,auVar4,auVar140);
  auVar67 = vfnmadd231ps_avx512vl(auVar66,auVar74,auVar140);
  auVar230._0_4_ = auVar71._0_4_ * 0.0;
  auVar230._4_4_ = auVar71._4_4_ * 0.0;
  auVar230._8_4_ = auVar71._8_4_ * 0.0;
  auVar230._12_4_ = auVar71._12_4_ * 0.0;
  auVar68 = vfmadd231ps_fma(auVar230,auVar72,auVar139);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar73,auVar68);
  auVar244._0_4_ = auVar65._0_4_ + auVar66._0_4_;
  auVar244._4_4_ = auVar65._4_4_ + auVar66._4_4_;
  auVar244._8_4_ = auVar65._8_4_ + auVar66._8_4_;
  auVar244._12_4_ = auVar65._12_4_ + auVar66._12_4_;
  auVar66 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar140);
  auVar68 = vfnmadd231ps_avx512vl(auVar66,auVar65,auVar140);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar70,auVar69);
  auVar66 = vfmadd231ps_fma(auVar66,auVar4,auVar139);
  auVar66 = vfmadd231ps_fma(auVar66,auVar74,auVar139);
  auVar69 = vmulps_avx512vl(auVar69,auVar140);
  auVar70 = vfnmadd231ps_avx512vl(auVar69,auVar140,auVar70);
  auVar4 = vfmadd231ps_fma(auVar70,auVar139,auVar4);
  auVar70 = vfnmadd231ps_fma(auVar4,auVar139,auVar74);
  auVar74 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar72,auVar71);
  auVar74 = vfmadd231ps_fma(auVar74,auVar73,auVar139);
  auVar74 = vfmadd231ps_fma(auVar74,auVar65,auVar139);
  auVar71 = vmulps_avx512vl(auVar71,auVar140);
  auVar72 = vfnmadd231ps_avx512vl(auVar71,auVar140,auVar72);
  auVar73 = vfmadd231ps_fma(auVar72,auVar139,auVar73);
  auVar4 = vfnmadd231ps_fma(auVar73,auVar139,auVar65);
  auVar65 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar73 = vshufps_avx(auVar244,auVar244,0xc9);
  fVar135 = auVar67._0_4_;
  auVar85._0_4_ = fVar135 * auVar73._0_4_;
  fVar136 = auVar67._4_4_;
  auVar85._4_4_ = fVar136 * auVar73._4_4_;
  fVar137 = auVar67._8_4_;
  auVar85._8_4_ = fVar137 * auVar73._8_4_;
  fVar147 = auVar67._12_4_;
  auVar85._12_4_ = fVar147 * auVar73._12_4_;
  auVar73 = vfmsub231ps_fma(auVar85,auVar65,auVar244);
  auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar73 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar91._0_4_ = fVar135 * auVar73._0_4_;
  auVar91._4_4_ = fVar136 * auVar73._4_4_;
  auVar91._8_4_ = fVar137 * auVar73._8_4_;
  auVar91._12_4_ = fVar147 * auVar73._12_4_;
  auVar65 = vfmsub231ps_fma(auVar91,auVar65,auVar68);
  auVar71 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar65 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar73 = vshufps_avx(auVar74,auVar74,0xc9);
  fVar155 = auVar70._0_4_;
  auVar86._0_4_ = fVar155 * auVar73._0_4_;
  fVar161 = auVar70._4_4_;
  auVar86._4_4_ = fVar161 * auVar73._4_4_;
  fVar162 = auVar70._8_4_;
  auVar86._8_4_ = fVar162 * auVar73._8_4_;
  fVar163 = auVar70._12_4_;
  auVar86._12_4_ = fVar163 * auVar73._12_4_;
  auVar73 = vfmsub231ps_fma(auVar86,auVar65,auVar74);
  auVar74 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar73 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar200._0_4_ = auVar73._0_4_ * fVar155;
  auVar200._4_4_ = auVar73._4_4_ * fVar161;
  auVar200._8_4_ = auVar73._8_4_ * fVar162;
  auVar200._12_4_ = auVar73._12_4_ * fVar163;
  auVar73 = vfmsub231ps_fma(auVar200,auVar65,auVar4);
  auVar65 = vdpps_avx(auVar72,auVar72,0x7f);
  auVar4 = vshufps_avx(auVar73,auVar73,0xc9);
  fVar129 = auVar65._0_4_;
  auVar201._4_12_ = ZEXT812(0) << 0x20;
  auVar201._0_4_ = fVar129;
  auVar73 = vrsqrt14ss_avx512f(auVar139,auVar201);
  auVar69 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
  auVar68 = vmulss_avx512f(auVar65,ZEXT416(0x3f000000));
  fVar218 = auVar73._0_4_;
  auVar73 = vdpps_avx(auVar72,auVar71,0x7f);
  fVar227 = auVar69._0_4_ - auVar68._0_4_ * fVar218 * fVar218 * fVar218;
  fVar229 = fVar227 * auVar72._0_4_;
  fVar240 = fVar227 * auVar72._4_4_;
  fVar241 = fVar227 * auVar72._8_4_;
  fVar242 = fVar227 * auVar72._12_4_;
  auVar211._0_4_ = auVar71._0_4_ * fVar129;
  auVar211._4_4_ = auVar71._4_4_ * fVar129;
  auVar211._8_4_ = auVar71._8_4_ * fVar129;
  auVar211._12_4_ = auVar71._12_4_ * fVar129;
  fVar129 = auVar73._0_4_;
  auVar180._0_4_ = fVar129 * auVar72._0_4_;
  auVar180._4_4_ = fVar129 * auVar72._4_4_;
  auVar180._8_4_ = fVar129 * auVar72._8_4_;
  auVar180._12_4_ = fVar129 * auVar72._12_4_;
  auVar72 = vsubps_avx(auVar211,auVar180);
  auVar73 = vrcp14ss_avx512f(auVar139,auVar201);
  auVar65 = vfnmadd213ss_avx512f(auVar65,auVar73,ZEXT416(0x40000000));
  fVar129 = auVar73._0_4_ * auVar65._0_4_;
  auVar65 = vdpps_avx(auVar74,auVar74,0x7f);
  fVar218 = auVar65._0_4_;
  auVar202._4_12_ = ZEXT812(0) << 0x20;
  auVar202._0_4_ = fVar218;
  auVar73 = vrsqrt14ss_avx512f(auVar139,auVar202);
  auVar71 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
  auVar69 = vmulss_avx512f(auVar65,ZEXT416(0x3f000000));
  fVar228 = auVar73._0_4_;
  fVar228 = auVar71._0_4_ - auVar69._0_4_ * fVar228 * fVar228 * fVar228;
  auVar73 = vdpps_avx(auVar74,auVar4,0x7f);
  fVar243 = fVar228 * auVar74._0_4_;
  fVar248 = fVar228 * auVar74._4_4_;
  fVar249 = fVar228 * auVar74._8_4_;
  fVar250 = fVar228 * auVar74._12_4_;
  auVar80._0_4_ = fVar218 * auVar4._0_4_;
  auVar80._4_4_ = fVar218 * auVar4._4_4_;
  auVar80._8_4_ = fVar218 * auVar4._8_4_;
  auVar80._12_4_ = fVar218 * auVar4._12_4_;
  fVar218 = auVar73._0_4_;
  auVar84._0_4_ = fVar218 * auVar74._0_4_;
  auVar84._4_4_ = fVar218 * auVar74._4_4_;
  auVar84._8_4_ = fVar218 * auVar74._8_4_;
  auVar84._12_4_ = fVar218 * auVar74._12_4_;
  auVar71 = vsubps_avx(auVar80,auVar84);
  auVar73 = vrcp14ss_avx512f(auVar139,auVar202);
  auVar65 = vfnmadd213ss_avx512f(auVar65,auVar73,ZEXT416(0x40000000));
  fVar218 = auVar65._0_4_ * auVar73._0_4_;
  auVar65 = vshufps_avx(auVar78,auVar78,0xff);
  auVar187._0_4_ = fVar229 * auVar65._0_4_;
  auVar187._4_4_ = fVar240 * auVar65._4_4_;
  auVar187._8_4_ = fVar241 * auVar65._8_4_;
  auVar187._12_4_ = fVar242 * auVar65._12_4_;
  local_530 = vsubps_avx(auVar78,auVar187);
  auVar73 = vshufps_avx(auVar67,auVar67,0xff);
  auVar81._0_4_ = auVar73._0_4_ * fVar229 + auVar65._0_4_ * fVar227 * fVar129 * auVar72._0_4_;
  auVar81._4_4_ = auVar73._4_4_ * fVar240 + auVar65._4_4_ * fVar227 * fVar129 * auVar72._4_4_;
  auVar81._8_4_ = auVar73._8_4_ * fVar241 + auVar65._8_4_ * fVar227 * fVar129 * auVar72._8_4_;
  auVar81._12_4_ = auVar73._12_4_ * fVar242 + auVar65._12_4_ * fVar227 * fVar129 * auVar72._12_4_;
  auVar72 = vsubps_avx(auVar67,auVar81);
  local_540._0_4_ = auVar187._0_4_ + auVar78._0_4_;
  local_540._4_4_ = auVar187._4_4_ + auVar78._4_4_;
  fStack_538 = auVar187._8_4_ + auVar78._8_4_;
  fStack_534 = auVar187._12_4_ + auVar78._12_4_;
  auVar65 = vshufps_avx(auVar66,auVar66,0xff);
  auVar87._0_4_ = fVar243 * auVar65._0_4_;
  auVar87._4_4_ = fVar248 * auVar65._4_4_;
  auVar87._8_4_ = fVar249 * auVar65._8_4_;
  auVar87._12_4_ = fVar250 * auVar65._12_4_;
  local_550 = vsubps_avx512vl(auVar66,auVar87);
  auVar73 = vshufps_avx(auVar70,auVar70,0xff);
  auVar75._0_4_ = auVar73._0_4_ * fVar243 + auVar65._0_4_ * fVar228 * auVar71._0_4_ * fVar218;
  auVar75._4_4_ = auVar73._4_4_ * fVar248 + auVar65._4_4_ * fVar228 * auVar71._4_4_ * fVar218;
  auVar75._8_4_ = auVar73._8_4_ * fVar249 + auVar65._8_4_ * fVar228 * auVar71._8_4_ * fVar218;
  auVar75._12_4_ = auVar73._12_4_ * fVar250 + auVar65._12_4_ * fVar228 * auVar71._12_4_ * fVar218;
  auVar65 = vsubps_avx(auVar70,auVar75);
  local_560._0_4_ = auVar66._0_4_ + auVar87._0_4_;
  local_560._4_4_ = auVar66._4_4_ + auVar87._4_4_;
  fStack_558 = auVar66._8_4_ + auVar87._8_4_;
  fStack_554 = auVar66._12_4_ + auVar87._12_4_;
  auVar88._0_4_ = auVar72._0_4_ * 0.33333334;
  auVar88._4_4_ = auVar72._4_4_ * 0.33333334;
  auVar88._8_4_ = auVar72._8_4_ * 0.33333334;
  auVar88._12_4_ = auVar72._12_4_ * 0.33333334;
  local_570 = vaddps_avx512vl(local_530,auVar88);
  auVar92._0_4_ = auVar65._0_4_ * 0.33333334;
  auVar92._4_4_ = auVar65._4_4_ * 0.33333334;
  auVar92._8_4_ = auVar65._8_4_ * 0.33333334;
  auVar92._12_4_ = auVar65._12_4_ * 0.33333334;
  local_580 = vsubps_avx512vl(local_550,auVar92);
  auVar67._0_4_ = (fVar135 + auVar81._0_4_) * 0.33333334;
  auVar67._4_4_ = (fVar136 + auVar81._4_4_) * 0.33333334;
  auVar67._8_4_ = (fVar137 + auVar81._8_4_) * 0.33333334;
  auVar67._12_4_ = (fVar147 + auVar81._12_4_) * 0.33333334;
  _local_590 = vaddps_avx512vl(_local_540,auVar67);
  auVar139._0_4_ = (fVar155 + auVar75._0_4_) * 0.33333334;
  auVar139._4_4_ = (fVar161 + auVar75._4_4_) * 0.33333334;
  auVar139._8_4_ = (fVar162 + auVar75._8_4_) * 0.33333334;
  auVar139._12_4_ = (fVar163 + auVar75._12_4_) * 0.33333334;
  _local_5a0 = vsubps_avx512vl(_local_560,auVar139);
  local_4b0 = vsubps_avx(local_530,auVar5);
  uVar138 = local_4b0._0_4_;
  auVar76._4_4_ = uVar138;
  auVar76._0_4_ = uVar138;
  auVar76._8_4_ = uVar138;
  auVar76._12_4_ = uVar138;
  auVar65 = vshufps_avx(local_4b0,local_4b0,0x55);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  auVar73 = vshufps_avx(local_4b0,local_4b0,0xaa);
  fVar129 = pre->ray_space[k].vz.field_0.m128[0];
  fVar218 = pre->ray_space[k].vz.field_0.m128[1];
  fVar227 = pre->ray_space[k].vz.field_0.m128[2];
  fVar228 = pre->ray_space[k].vz.field_0.m128[3];
  auVar140._0_4_ = fVar129 * auVar73._0_4_;
  auVar140._4_4_ = fVar218 * auVar73._4_4_;
  auVar140._8_4_ = fVar227 * auVar73._8_4_;
  auVar140._12_4_ = fVar228 * auVar73._12_4_;
  auVar65 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar3,auVar65);
  auVar70 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar76);
  local_4c0 = vsubps_avx512vl(local_570,auVar5);
  uVar138 = local_4c0._0_4_;
  auVar82._4_4_ = uVar138;
  auVar82._0_4_ = uVar138;
  auVar82._8_4_ = uVar138;
  auVar82._12_4_ = uVar138;
  auVar65 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar73 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar77._0_4_ = fVar129 * auVar73._0_4_;
  auVar77._4_4_ = fVar218 * auVar73._4_4_;
  auVar77._8_4_ = fVar227 * auVar73._8_4_;
  auVar77._12_4_ = fVar228 * auVar73._12_4_;
  auVar65 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar65);
  auVar69 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar82);
  local_4d0 = vsubps_avx512vl(local_580,auVar5);
  uVar138 = local_4d0._0_4_;
  auVar89._4_4_ = uVar138;
  auVar89._0_4_ = uVar138;
  auVar89._8_4_ = uVar138;
  auVar89._12_4_ = uVar138;
  auVar65 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar73 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar83._0_4_ = fVar129 * auVar73._0_4_;
  auVar83._4_4_ = fVar218 * auVar73._4_4_;
  auVar83._8_4_ = fVar227 * auVar73._8_4_;
  auVar83._12_4_ = fVar228 * auVar73._12_4_;
  auVar65 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar3,auVar65);
  auVar66 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar89);
  local_4e0 = vsubps_avx512vl(local_550,auVar5);
  uVar138 = local_4e0._0_4_;
  auVar188._4_4_ = uVar138;
  auVar188._0_4_ = uVar138;
  auVar188._8_4_ = uVar138;
  auVar188._12_4_ = uVar138;
  auVar65 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar73 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar90._0_4_ = fVar129 * auVar73._0_4_;
  auVar90._4_4_ = fVar218 * auVar73._4_4_;
  auVar90._8_4_ = fVar227 * auVar73._8_4_;
  auVar90._12_4_ = fVar228 * auVar73._12_4_;
  auVar65 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar3,auVar65);
  auVar68 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar188);
  local_4f0 = vsubps_avx(_local_540,auVar5);
  uVar138 = local_4f0._0_4_;
  auVar189._4_4_ = uVar138;
  auVar189._0_4_ = uVar138;
  auVar189._8_4_ = uVar138;
  auVar189._12_4_ = uVar138;
  auVar65 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar73 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar212._0_4_ = auVar73._0_4_ * fVar129;
  auVar212._4_4_ = auVar73._4_4_ * fVar218;
  auVar212._8_4_ = auVar73._8_4_ * fVar227;
  auVar212._12_4_ = auVar73._12_4_ * fVar228;
  auVar65 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar3,auVar65);
  auVar67 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar189);
  local_500 = vsubps_avx512vl(_local_590,auVar5);
  uVar138 = local_500._0_4_;
  auVar190._4_4_ = uVar138;
  auVar190._0_4_ = uVar138;
  auVar190._8_4_ = uVar138;
  auVar190._12_4_ = uVar138;
  auVar65 = vshufps_avx(local_500,local_500,0x55);
  auVar73 = vshufps_avx(local_500,local_500,0xaa);
  auVar219._0_4_ = auVar73._0_4_ * fVar129;
  auVar219._4_4_ = auVar73._4_4_ * fVar218;
  auVar219._8_4_ = auVar73._8_4_ * fVar227;
  auVar219._12_4_ = auVar73._12_4_ * fVar228;
  auVar65 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar3,auVar65);
  auVar139 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar190);
  local_510 = vsubps_avx512vl(_local_5a0,auVar5);
  uVar138 = local_510._0_4_;
  auVar191._4_4_ = uVar138;
  auVar191._0_4_ = uVar138;
  auVar191._8_4_ = uVar138;
  auVar191._12_4_ = uVar138;
  auVar65 = vshufps_avx(local_510,local_510,0x55);
  auVar73 = vshufps_avx(local_510,local_510,0xaa);
  auVar231._0_4_ = auVar73._0_4_ * fVar129;
  auVar231._4_4_ = auVar73._4_4_ * fVar218;
  auVar231._8_4_ = auVar73._8_4_ * fVar227;
  auVar231._12_4_ = auVar73._12_4_ * fVar228;
  auVar65 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar3,auVar65);
  auVar140 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar191);
  local_520 = vsubps_avx(_local_560,auVar5);
  uVar138 = local_520._0_4_;
  auVar79._4_4_ = uVar138;
  auVar79._0_4_ = uVar138;
  auVar79._8_4_ = uVar138;
  auVar79._12_4_ = uVar138;
  auVar65 = vshufps_avx(local_520,local_520,0x55);
  auVar73 = vshufps_avx(local_520,local_520,0xaa);
  auVar181._0_4_ = auVar73._0_4_ * fVar129;
  auVar181._4_4_ = auVar73._4_4_ * fVar218;
  auVar181._8_4_ = auVar73._8_4_ * fVar227;
  auVar181._12_4_ = auVar73._12_4_ * fVar228;
  auVar65 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar65);
  auVar5 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar79);
  auVar72 = vmovlhps_avx(auVar70,auVar67);
  auVar71 = vmovlhps_avx(auVar69,auVar139);
  auVar4 = vmovlhps_avx512f(auVar66,auVar140);
  _local_490 = vmovlhps_avx512f(auVar68,auVar5);
  auVar73 = vminps_avx(auVar72,auVar71);
  auVar65 = vmaxps_avx(auVar72,auVar71);
  auVar74 = vminps_avx512vl(auVar4,_local_490);
  auVar73 = vminps_avx(auVar73,auVar74);
  auVar74 = vmaxps_avx512vl(auVar4,_local_490);
  auVar65 = vmaxps_avx(auVar65,auVar74);
  auVar74 = vshufpd_avx(auVar73,auVar73,3);
  auVar73 = vminps_avx(auVar73,auVar74);
  auVar74 = vshufpd_avx(auVar65,auVar65,3);
  auVar65 = vmaxps_avx(auVar65,auVar74);
  auVar73 = vandps_avx512vl(auVar73,auVar261._0_16_);
  auVar65 = vandps_avx512vl(auVar65,auVar261._0_16_);
  auVar65 = vmaxps_avx(auVar73,auVar65);
  auVar73 = vmovshdup_avx(auVar65);
  auVar65 = vmaxss_avx(auVar73,auVar65);
  auVar74 = vmovddup_avx512vl(auVar70);
  auVar70 = vmovddup_avx512vl(auVar69);
  auVar69 = vmovddup_avx512vl(auVar66);
  auVar68 = vmovddup_avx512vl(auVar68);
  local_4a0 = ZEXT416((uint)(auVar65._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4a0);
  auVar65 = vxorps_avx512vl(local_440._0_16_,auVar262._0_16_);
  local_460 = vbroadcastss_avx512vl(auVar65);
  uVar54 = 0;
  auVar65 = vsubps_avx(auVar71,auVar72);
  local_470 = vsubps_avx512vl(auVar4,auVar71);
  local_480 = vsubps_avx512vl(_local_490,auVar4);
  local_5b0 = vsubps_avx(_local_540,local_530);
  local_5c0 = vsubps_avx512vl(_local_590,local_570);
  local_5d0 = vsubps_avx512vl(_local_5a0,local_580);
  _local_5e0 = vsubps_avx512vl(_local_560,local_550);
  auVar134 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar134);
  auVar134 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar134);
  auVar73 = ZEXT816(0x3f80000000000000);
  auVar126._32_32_ = auVar134._32_32_;
  auVar66 = auVar73;
LAB_019ca4fd:
  do {
    auVar269 = ZEXT3264(local_440);
    auVar268 = ZEXT1664(auVar68);
    auVar79 = vshufps_avx(auVar66,auVar66,0x50);
    auVar251._8_4_ = 0x3f800000;
    auVar251._0_8_ = 0x3f8000003f800000;
    auVar251._12_4_ = 0x3f800000;
    auVar254._16_4_ = 0x3f800000;
    auVar254._0_16_ = auVar251;
    auVar254._20_4_ = 0x3f800000;
    auVar254._24_4_ = 0x3f800000;
    auVar254._28_4_ = 0x3f800000;
    auVar78 = vsubps_avx(auVar251,auVar79);
    fVar129 = auVar79._0_4_;
    fVar135 = auVar67._0_4_;
    auVar156._0_4_ = fVar135 * fVar129;
    fVar218 = auVar79._4_4_;
    fVar136 = auVar67._4_4_;
    auVar156._4_4_ = fVar136 * fVar218;
    fVar227 = auVar79._8_4_;
    auVar156._8_4_ = fVar135 * fVar227;
    fVar228 = auVar79._12_4_;
    auVar156._12_4_ = fVar136 * fVar228;
    fVar137 = auVar139._0_4_;
    auVar164._0_4_ = fVar137 * fVar129;
    fVar147 = auVar139._4_4_;
    auVar164._4_4_ = fVar147 * fVar218;
    auVar164._8_4_ = fVar137 * fVar227;
    auVar164._12_4_ = fVar147 * fVar228;
    fVar155 = auVar140._0_4_;
    auVar173._0_4_ = fVar155 * fVar129;
    fVar161 = auVar140._4_4_;
    auVar173._4_4_ = fVar161 * fVar218;
    auVar173._8_4_ = fVar155 * fVar227;
    auVar173._12_4_ = fVar161 * fVar228;
    fVar162 = auVar5._0_4_;
    auVar142._0_4_ = fVar162 * fVar129;
    fVar163 = auVar5._4_4_;
    auVar142._4_4_ = fVar163 * fVar218;
    auVar142._8_4_ = fVar162 * fVar227;
    auVar142._12_4_ = fVar163 * fVar228;
    auVar75 = vfmadd231ps_avx512vl(auVar156,auVar78,auVar74);
    auVar76 = vfmadd231ps_avx512vl(auVar164,auVar78,auVar70);
    auVar77 = vfmadd231ps_avx512vl(auVar173,auVar78,auVar69);
    auVar78 = vfmadd231ps_avx512vl(auVar142,auVar68,auVar78);
    auVar79 = vmovshdup_avx(auVar73);
    fVar218 = auVar73._0_4_;
    fVar129 = (auVar79._0_4_ - fVar218) * 0.04761905;
    auVar199._4_4_ = fVar218;
    auVar199._0_4_ = fVar218;
    auVar199._8_4_ = fVar218;
    auVar199._12_4_ = fVar218;
    auVar199._16_4_ = fVar218;
    auVar199._20_4_ = fVar218;
    auVar199._24_4_ = fVar218;
    auVar199._28_4_ = fVar218;
    auVar153._0_8_ = auVar79._0_8_;
    auVar153._8_8_ = auVar153._0_8_;
    auVar153._16_8_ = auVar153._0_8_;
    auVar153._24_8_ = auVar153._0_8_;
    auVar99 = vsubps_avx(auVar153,auVar199);
    uVar138 = auVar75._0_4_;
    auVar154._4_4_ = uVar138;
    auVar154._0_4_ = uVar138;
    auVar154._8_4_ = uVar138;
    auVar154._12_4_ = uVar138;
    auVar154._16_4_ = uVar138;
    auVar154._20_4_ = uVar138;
    auVar154._24_4_ = uVar138;
    auVar154._28_4_ = uVar138;
    auVar215._8_4_ = 1;
    auVar215._0_8_ = 0x100000001;
    auVar215._12_4_ = 1;
    auVar215._16_4_ = 1;
    auVar215._20_4_ = 1;
    auVar215._24_4_ = 1;
    auVar215._28_4_ = 1;
    auVar109 = ZEXT1632(auVar75);
    auVar97 = vpermps_avx2(auVar215,auVar109);
    auVar98 = vbroadcastss_avx512vl(auVar76);
    auVar110 = ZEXT1632(auVar76);
    auVar100 = vpermps_avx512vl(auVar215,auVar110);
    auVar101 = vbroadcastss_avx512vl(auVar77);
    auVar94 = ZEXT1632(auVar77);
    auVar102 = vpermps_avx512vl(auVar215,auVar94);
    auVar103 = vbroadcastss_avx512vl(auVar78);
    auVar106 = ZEXT1632(auVar78);
    auVar104 = vpermps_avx512vl(auVar215,auVar106);
    auVar216._4_4_ = fVar129;
    auVar216._0_4_ = fVar129;
    auVar216._8_4_ = fVar129;
    auVar216._12_4_ = fVar129;
    auVar216._16_4_ = fVar129;
    auVar216._20_4_ = fVar129;
    auVar216._24_4_ = fVar129;
    auVar216._28_4_ = fVar129;
    auVar107 = auVar267._0_32_;
    auVar95 = vpermps_avx512vl(auVar107,auVar109);
    auVar186._8_4_ = 3;
    auVar186._0_8_ = 0x300000003;
    auVar186._12_4_ = 3;
    auVar186._16_4_ = 3;
    auVar186._20_4_ = 3;
    auVar186._24_4_ = 3;
    auVar186._28_4_ = 3;
    auVar96 = vpermps_avx512vl(auVar186,auVar109);
    auVar105 = vpermps_avx512vl(auVar107,auVar110);
    auVar109 = vpermps_avx2(auVar186,auVar110);
    auVar93 = vpermps_avx512vl(auVar107,auVar94);
    auVar110 = vpermps_avx2(auVar186,auVar94);
    auVar94 = vpermps_avx512vl(auVar107,auVar106);
    auVar106 = vpermps_avx512vl(auVar186,auVar106);
    auVar79 = vfmadd132ps_fma(auVar99,auVar199,_DAT_01f7b040);
    auVar99 = vsubps_avx(auVar254,ZEXT1632(auVar79));
    auVar107 = vmulps_avx512vl(auVar98,ZEXT1632(auVar79));
    auVar111 = ZEXT1632(auVar79);
    auVar108 = vmulps_avx512vl(auVar100,auVar111);
    auVar78 = vfmadd231ps_fma(auVar107,auVar99,auVar154);
    auVar75 = vfmadd231ps_fma(auVar108,auVar99,auVar97);
    auVar107 = vmulps_avx512vl(auVar101,auVar111);
    auVar108 = vmulps_avx512vl(auVar102,auVar111);
    auVar98 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar98);
    auVar100 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar100);
    auVar107 = vmulps_avx512vl(auVar103,auVar111);
    auVar108 = ZEXT1632(auVar79);
    auVar104 = vmulps_avx512vl(auVar104,auVar108);
    auVar101 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar101);
    auVar102 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar102);
    fVar227 = auVar79._0_4_;
    fVar228 = auVar79._4_4_;
    auVar30._4_4_ = fVar228 * auVar98._4_4_;
    auVar30._0_4_ = fVar227 * auVar98._0_4_;
    fVar229 = auVar79._8_4_;
    auVar30._8_4_ = fVar229 * auVar98._8_4_;
    fVar240 = auVar79._12_4_;
    auVar30._12_4_ = fVar240 * auVar98._12_4_;
    auVar30._16_4_ = auVar98._16_4_ * 0.0;
    auVar30._20_4_ = auVar98._20_4_ * 0.0;
    auVar30._24_4_ = auVar98._24_4_ * 0.0;
    auVar30._28_4_ = fVar218;
    auVar31._4_4_ = fVar228 * auVar100._4_4_;
    auVar31._0_4_ = fVar227 * auVar100._0_4_;
    auVar31._8_4_ = fVar229 * auVar100._8_4_;
    auVar31._12_4_ = fVar240 * auVar100._12_4_;
    auVar31._16_4_ = auVar100._16_4_ * 0.0;
    auVar31._20_4_ = auVar100._20_4_ * 0.0;
    auVar31._24_4_ = auVar100._24_4_ * 0.0;
    auVar31._28_4_ = auVar97._28_4_;
    auVar78 = vfmadd231ps_fma(auVar30,auVar99,ZEXT1632(auVar78));
    auVar75 = vfmadd231ps_fma(auVar31,auVar99,ZEXT1632(auVar75));
    auVar145._0_4_ = fVar227 * auVar101._0_4_;
    auVar145._4_4_ = fVar228 * auVar101._4_4_;
    auVar145._8_4_ = fVar229 * auVar101._8_4_;
    auVar145._12_4_ = fVar240 * auVar101._12_4_;
    auVar145._16_4_ = auVar101._16_4_ * 0.0;
    auVar145._20_4_ = auVar101._20_4_ * 0.0;
    auVar145._24_4_ = auVar101._24_4_ * 0.0;
    auVar145._28_4_ = 0;
    auVar32._4_4_ = fVar228 * auVar102._4_4_;
    auVar32._0_4_ = fVar227 * auVar102._0_4_;
    auVar32._8_4_ = fVar229 * auVar102._8_4_;
    auVar32._12_4_ = fVar240 * auVar102._12_4_;
    auVar32._16_4_ = auVar102._16_4_ * 0.0;
    auVar32._20_4_ = auVar102._20_4_ * 0.0;
    auVar32._24_4_ = auVar102._24_4_ * 0.0;
    auVar32._28_4_ = auVar101._28_4_;
    auVar76 = vfmadd231ps_fma(auVar145,auVar99,auVar98);
    auVar77 = vfmadd231ps_fma(auVar32,auVar99,auVar100);
    auVar33._28_4_ = auVar100._28_4_;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(fVar240 * auVar77._12_4_,
                            CONCAT48(fVar229 * auVar77._8_4_,
                                     CONCAT44(fVar228 * auVar77._4_4_,fVar227 * auVar77._0_4_))));
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar240 * auVar76._12_4_,
                                                 CONCAT48(fVar229 * auVar76._8_4_,
                                                          CONCAT44(fVar228 * auVar76._4_4_,
                                                                   fVar227 * auVar76._0_4_)))),
                              auVar99,ZEXT1632(auVar78));
    auVar92 = vfmadd231ps_fma(auVar33,auVar99,ZEXT1632(auVar75));
    auVar97 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar78));
    auVar98 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar75));
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar97 = vmulps_avx512vl(auVar97,auVar100);
    auVar98 = vmulps_avx512vl(auVar98,auVar100);
    auVar210._0_4_ = fVar129 * auVar97._0_4_;
    auVar210._4_4_ = fVar129 * auVar97._4_4_;
    auVar210._8_4_ = fVar129 * auVar97._8_4_;
    auVar210._12_4_ = fVar129 * auVar97._12_4_;
    auVar210._16_4_ = fVar129 * auVar97._16_4_;
    auVar210._20_4_ = fVar129 * auVar97._20_4_;
    auVar210._24_4_ = fVar129 * auVar97._24_4_;
    auVar210._28_4_ = 0;
    auVar97 = vmulps_avx512vl(auVar216,auVar98);
    auVar75 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
    auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar88),_DAT_01fb9fc0,ZEXT1632(auVar75));
    auVar101 = vpermt2ps_avx512vl(ZEXT1632(auVar92),_DAT_01fb9fc0,ZEXT1632(auVar75));
    auVar146._0_4_ = auVar210._0_4_ + auVar88._0_4_;
    auVar146._4_4_ = auVar210._4_4_ + auVar88._4_4_;
    auVar146._8_4_ = auVar210._8_4_ + auVar88._8_4_;
    auVar146._12_4_ = auVar210._12_4_ + auVar88._12_4_;
    auVar146._16_4_ = auVar210._16_4_ + 0.0;
    auVar146._20_4_ = auVar210._20_4_ + 0.0;
    auVar146._24_4_ = auVar210._24_4_ + 0.0;
    auVar146._28_4_ = 0;
    auVar111 = ZEXT1632(auVar75);
    auVar102 = vpermt2ps_avx512vl(auVar210,_DAT_01fb9fc0,auVar111);
    auVar103 = vaddps_avx512vl(ZEXT1632(auVar92),auVar97);
    auVar104 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar111);
    auVar97 = vsubps_avx(auVar98,auVar102);
    auVar102 = vsubps_avx512vl(auVar101,auVar104);
    auVar104 = vmulps_avx512vl(auVar105,auVar108);
    auVar107 = vmulps_avx512vl(auVar109,auVar108);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar95);
    auVar95 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar96);
    auVar96 = vmulps_avx512vl(auVar93,auVar108);
    auVar107 = vmulps_avx512vl(auVar110,auVar108);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar105);
    auVar109 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar109);
    auVar105 = vmulps_avx512vl(auVar94,auVar108);
    auVar94 = vmulps_avx512vl(auVar106,auVar108);
    auVar78 = vfmadd231ps_fma(auVar105,auVar99,auVar93);
    auVar105 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar110);
    auVar93 = vmulps_avx512vl(auVar108,auVar96);
    auVar106 = ZEXT1632(auVar79);
    auVar94 = vmulps_avx512vl(auVar106,auVar109);
    auVar104 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar104);
    auVar95 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar95);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar240 * auVar78._12_4_,
                                            CONCAT48(fVar229 * auVar78._8_4_,
                                                     CONCAT44(fVar228 * auVar78._4_4_,
                                                              fVar227 * auVar78._0_4_)))),auVar99,
                         auVar96);
    auVar109 = vfmadd231ps_avx512vl(auVar105,auVar99,auVar109);
    auVar34._4_4_ = fVar228 * auVar96._4_4_;
    auVar34._0_4_ = fVar227 * auVar96._0_4_;
    auVar34._8_4_ = fVar229 * auVar96._8_4_;
    auVar34._12_4_ = fVar240 * auVar96._12_4_;
    auVar34._16_4_ = auVar96._16_4_ * 0.0;
    auVar34._20_4_ = auVar96._20_4_ * 0.0;
    auVar34._24_4_ = auVar96._24_4_ * 0.0;
    auVar34._28_4_ = auVar110._28_4_;
    auVar110 = vmulps_avx512vl(auVar106,auVar109);
    auVar105 = vfmadd231ps_avx512vl(auVar34,auVar99,auVar104);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar95,auVar99);
    auVar99 = vsubps_avx512vl(auVar96,auVar104);
    auVar109 = vsubps_avx512vl(auVar109,auVar95);
    auVar99 = vmulps_avx512vl(auVar99,auVar100);
    auVar109 = vmulps_avx512vl(auVar109,auVar100);
    fVar218 = fVar129 * auVar99._0_4_;
    fVar227 = fVar129 * auVar99._4_4_;
    auVar35._4_4_ = fVar227;
    auVar35._0_4_ = fVar218;
    fVar228 = fVar129 * auVar99._8_4_;
    auVar35._8_4_ = fVar228;
    fVar229 = fVar129 * auVar99._12_4_;
    auVar35._12_4_ = fVar229;
    fVar240 = fVar129 * auVar99._16_4_;
    auVar35._16_4_ = fVar240;
    fVar241 = fVar129 * auVar99._20_4_;
    auVar35._20_4_ = fVar241;
    fVar129 = fVar129 * auVar99._24_4_;
    auVar35._24_4_ = fVar129;
    auVar35._28_4_ = auVar99._28_4_;
    auVar109 = vmulps_avx512vl(auVar216,auVar109);
    auVar100 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar111);
    auVar104 = vpermt2ps_avx512vl(auVar110,_DAT_01fb9fc0,auVar111);
    auVar217._0_4_ = auVar105._0_4_ + fVar218;
    auVar217._4_4_ = auVar105._4_4_ + fVar227;
    auVar217._8_4_ = auVar105._8_4_ + fVar228;
    auVar217._12_4_ = auVar105._12_4_ + fVar229;
    auVar217._16_4_ = auVar105._16_4_ + fVar240;
    auVar217._20_4_ = auVar105._20_4_ + fVar241;
    auVar217._24_4_ = auVar105._24_4_ + fVar129;
    auVar217._28_4_ = auVar105._28_4_ + auVar99._28_4_;
    auVar99 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9fc0,ZEXT1632(auVar75));
    auVar95 = vaddps_avx512vl(auVar110,auVar109);
    auVar109 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,ZEXT1632(auVar75));
    auVar99 = vsubps_avx(auVar100,auVar99);
    auVar109 = vsubps_avx512vl(auVar104,auVar109);
    auVar159 = ZEXT1632(auVar88);
    auVar96 = vsubps_avx512vl(auVar105,auVar159);
    auVar170 = ZEXT1632(auVar92);
    auVar93 = vsubps_avx512vl(auVar110,auVar170);
    auVar94 = vsubps_avx512vl(auVar100,auVar98);
    auVar96 = vaddps_avx512vl(auVar96,auVar94);
    auVar94 = vsubps_avx512vl(auVar104,auVar101);
    auVar93 = vaddps_avx512vl(auVar93,auVar94);
    auVar94 = vmulps_avx512vl(auVar170,auVar96);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar159,auVar93);
    auVar106 = vmulps_avx512vl(auVar103,auVar96);
    auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar146,auVar93);
    auVar107 = vmulps_avx512vl(auVar102,auVar96);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar97,auVar93);
    auVar108 = vmulps_avx512vl(auVar101,auVar96);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar98,auVar93);
    auVar111 = vmulps_avx512vl(auVar110,auVar96);
    auVar111 = vfnmadd231ps_avx512vl(auVar111,auVar105,auVar93);
    auVar112 = vmulps_avx512vl(auVar95,auVar96);
    auVar112 = vfnmadd231ps_avx512vl(auVar112,auVar217,auVar93);
    auVar113 = vmulps_avx512vl(auVar109,auVar96);
    auVar113 = vfnmadd231ps_avx512vl(auVar113,auVar99,auVar93);
    auVar96 = vmulps_avx512vl(auVar104,auVar96);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar100,auVar93);
    auVar93 = vminps_avx512vl(auVar94,auVar106);
    auVar94 = vmaxps_avx512vl(auVar94,auVar106);
    auVar106 = vminps_avx512vl(auVar107,auVar108);
    auVar93 = vminps_avx512vl(auVar93,auVar106);
    auVar106 = vmaxps_avx512vl(auVar107,auVar108);
    auVar94 = vmaxps_avx512vl(auVar94,auVar106);
    auVar106 = vminps_avx512vl(auVar111,auVar112);
    auVar107 = vmaxps_avx512vl(auVar111,auVar112);
    auVar108 = vminps_avx512vl(auVar113,auVar96);
    auVar106 = vminps_avx512vl(auVar106,auVar108);
    auVar93 = vminps_avx512vl(auVar93,auVar106);
    auVar96 = vmaxps_avx512vl(auVar113,auVar96);
    auVar96 = vmaxps_avx512vl(auVar107,auVar96);
    auVar96 = vmaxps_avx512vl(auVar94,auVar96);
    uVar24 = vcmpps_avx512vl(auVar93,local_440,2);
    uVar25 = vcmpps_avx512vl(auVar96,local_460,5);
    bVar52 = (byte)uVar24 & (byte)uVar25 & 0x7f;
    if (bVar52 != 0) {
      auVar96 = vsubps_avx512vl(auVar98,auVar159);
      auVar93 = vsubps_avx512vl(auVar101,auVar170);
      auVar94 = vsubps_avx512vl(auVar100,auVar105);
      auVar96 = vaddps_avx512vl(auVar96,auVar94);
      auVar94 = vsubps_avx512vl(auVar104,auVar110);
      auVar93 = vaddps_avx512vl(auVar93,auVar94);
      auVar94 = vmulps_avx512vl(auVar170,auVar96);
      auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar93,auVar159);
      auVar103 = vmulps_avx512vl(auVar103,auVar96);
      auVar103 = vfnmadd213ps_avx512vl(auVar146,auVar93,auVar103);
      auVar102 = vmulps_avx512vl(auVar102,auVar96);
      auVar102 = vfnmadd213ps_avx512vl(auVar97,auVar93,auVar102);
      auVar97 = vmulps_avx512vl(auVar101,auVar96);
      auVar101 = vfnmadd231ps_avx512vl(auVar97,auVar93,auVar98);
      auVar97 = vmulps_avx512vl(auVar110,auVar96);
      auVar110 = vfnmadd231ps_avx512vl(auVar97,auVar93,auVar105);
      auVar97 = vmulps_avx512vl(auVar95,auVar96);
      auVar95 = vfnmadd213ps_avx512vl(auVar217,auVar93,auVar97);
      auVar97 = vmulps_avx512vl(auVar109,auVar96);
      auVar105 = vfnmadd213ps_avx512vl(auVar99,auVar93,auVar97);
      auVar99 = vmulps_avx512vl(auVar104,auVar96);
      auVar100 = vfnmadd231ps_avx512vl(auVar99,auVar100,auVar93);
      auVar97 = vminps_avx(auVar94,auVar103);
      auVar99 = vmaxps_avx(auVar94,auVar103);
      auVar98 = vminps_avx(auVar102,auVar101);
      auVar98 = vminps_avx(auVar97,auVar98);
      auVar97 = vmaxps_avx(auVar102,auVar101);
      auVar99 = vmaxps_avx(auVar99,auVar97);
      auVar109 = vminps_avx(auVar110,auVar95);
      auVar97 = vmaxps_avx(auVar110,auVar95);
      auVar110 = vminps_avx(auVar105,auVar100);
      auVar109 = vminps_avx(auVar109,auVar110);
      auVar109 = vminps_avx(auVar98,auVar109);
      auVar98 = vmaxps_avx(auVar105,auVar100);
      auVar97 = vmaxps_avx(auVar97,auVar98);
      auVar99 = vmaxps_avx(auVar99,auVar97);
      uVar24 = vcmpps_avx512vl(auVar99,local_460,5);
      uVar25 = vcmpps_avx512vl(auVar109,local_440,2);
      bVar52 = bVar52 & (byte)uVar24 & (byte)uVar25;
      if (bVar52 != 0) {
        auStack_5f0[uVar54] = (uint)bVar52;
        uVar24 = vmovlps_avx(auVar73);
        (&uStack_420)[uVar54] = uVar24;
        uVar60 = vmovlps_avx(auVar66);
        auStack_3a0[uVar54] = uVar60;
        uVar54 = (ulong)((int)uVar54 + 1);
      }
    }
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar134 = ZEXT1664(auVar73);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar261 = ZEXT1664(auVar73);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar262 = ZEXT1664(auVar73);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar263 = ZEXT3264(auVar99);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar264 = ZEXT1664(auVar73);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar265 = ZEXT1664(auVar73);
    auVar127._32_32_ = auVar126._32_32_;
    auVar127._0_32_ = _DAT_01fb9fe0;
    auVar266 = ZEXT3264(_DAT_01fb9fe0);
    auVar128._16_48_ = auVar127._16_48_;
    auVar128._0_16_ = auVar65;
LAB_019ca9f4:
    do {
      do {
        do {
          if ((int)uVar54 == 0) {
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar29._4_4_ = uVar138;
            auVar29._0_4_ = uVar138;
            auVar29._8_4_ = uVar138;
            auVar29._12_4_ = uVar138;
            auVar29._16_4_ = uVar138;
            auVar29._20_4_ = uVar138;
            auVar29._24_4_ = uVar138;
            auVar29._28_4_ = uVar138;
            uVar24 = vcmpps_avx512vl(local_3c0,auVar29,2);
            uVar59 = (ulong)((uint)uVar59 & (uint)uVar24);
            goto LAB_019c9da5;
          }
          uVar53 = (int)uVar54 - 1;
          uVar55 = (ulong)uVar53;
          uVar8 = auStack_5f0[uVar55];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = auStack_3a0[uVar55];
          uVar60 = 0;
          for (uVar58 = (ulong)uVar8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000)
          {
            uVar60 = uVar60 + 1;
          }
          uVar57 = uVar8 - 1 & uVar8;
          bVar63 = uVar57 == 0;
          auStack_5f0[uVar55] = uVar57;
          if (bVar63) {
            uVar54 = (ulong)uVar53;
          }
          auVar130._8_8_ = 0;
          auVar130._0_8_ = uVar60;
          auVar73 = vpunpcklqdq_avx(auVar130,ZEXT416((int)uVar60 + 1));
          auVar126._32_32_ = auVar128._32_32_;
          auVar73 = vcvtqq2ps_avx512vl(auVar73);
          auVar73 = vmulps_avx512vl(auVar73,auVar264._0_16_);
          uVar138 = *(undefined4 *)((long)&uStack_420 + uVar55 * 8 + 4);
          auVar26._4_4_ = uVar138;
          auVar26._0_4_ = uVar138;
          auVar26._8_4_ = uVar138;
          auVar26._12_4_ = uVar138;
          auVar79 = vmulps_avx512vl(auVar73,auVar26);
          auVar78 = auVar265._0_16_;
          auVar73 = vsubps_avx512vl(auVar78,auVar73);
          uVar138 = *(undefined4 *)(&uStack_420 + uVar55);
          auVar27._4_4_ = uVar138;
          auVar27._0_4_ = uVar138;
          auVar27._8_4_ = uVar138;
          auVar27._12_4_ = uVar138;
          auVar73 = vfmadd231ps_avx512vl(auVar79,auVar73,auVar27);
          auVar79 = vmovshdup_avx(auVar73);
          fVar129 = auVar79._0_4_ - auVar73._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar129));
          if (uVar8 == 0 || bVar63) goto LAB_019ca4fd;
          auVar79 = vshufps_avx(auVar66,auVar66,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar129));
          auVar77 = vsubps_avx512vl(auVar78,auVar79);
          fVar218 = auVar79._0_4_;
          auVar165._0_4_ = fVar218 * fVar135;
          fVar227 = auVar79._4_4_;
          auVar165._4_4_ = fVar227 * fVar136;
          fVar228 = auVar79._8_4_;
          auVar165._8_4_ = fVar228 * fVar135;
          fVar229 = auVar79._12_4_;
          auVar165._12_4_ = fVar229 * fVar136;
          auVar174._0_4_ = fVar218 * fVar137;
          auVar174._4_4_ = fVar227 * fVar147;
          auVar174._8_4_ = fVar228 * fVar137;
          auVar174._12_4_ = fVar229 * fVar147;
          auVar182._0_4_ = fVar218 * fVar155;
          auVar182._4_4_ = fVar227 * fVar161;
          auVar182._8_4_ = fVar228 * fVar155;
          auVar182._12_4_ = fVar229 * fVar161;
          auVar148._0_4_ = fVar218 * fVar162;
          auVar148._4_4_ = fVar227 * fVar163;
          auVar148._8_4_ = fVar228 * fVar162;
          auVar148._12_4_ = fVar229 * fVar163;
          auVar79 = vfmadd231ps_fma(auVar165,auVar77,auVar74);
          auVar75 = vfmadd231ps_fma(auVar174,auVar77,auVar70);
          auVar76 = vfmadd231ps_fma(auVar182,auVar77,auVar69);
          auVar77 = vfmadd231ps_fma(auVar148,auVar77,auVar68);
          auVar160._16_16_ = auVar79;
          auVar160._0_16_ = auVar79;
          auVar171._16_16_ = auVar75;
          auVar171._0_16_ = auVar75;
          auVar179._16_16_ = auVar76;
          auVar179._0_16_ = auVar76;
          auVar97 = vpermps_avx512vl(auVar266._0_32_,ZEXT1632(auVar73));
          auVar99 = vsubps_avx(auVar171,auVar160);
          auVar75 = vfmadd213ps_fma(auVar99,auVar97,auVar160);
          auVar99 = vsubps_avx(auVar179,auVar171);
          auVar88 = vfmadd213ps_fma(auVar99,auVar97,auVar171);
          auVar79 = vsubps_avx(auVar77,auVar76);
          auVar172._16_16_ = auVar79;
          auVar172._0_16_ = auVar79;
          auVar79 = vfmadd213ps_fma(auVar172,auVar97,auVar179);
          auVar99 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar75));
          auVar75 = vfmadd213ps_fma(auVar99,auVar97,ZEXT1632(auVar75));
          auVar99 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar88));
          auVar79 = vfmadd213ps_fma(auVar99,auVar97,ZEXT1632(auVar88));
          auVar99 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar75));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar99,auVar97);
          auVar126._0_32_ = vmulps_avx512vl(auVar99,auVar263._0_32_);
          fVar218 = fVar129 * 0.33333334;
          auVar183._0_8_ =
               CONCAT44(auVar91._4_4_ + fVar218 * auVar126._4_4_,
                        auVar91._0_4_ + fVar218 * auVar126._0_4_);
          auVar183._8_4_ = auVar91._8_4_ + fVar218 * auVar126._8_4_;
          auVar183._12_4_ = auVar91._12_4_ + fVar218 * auVar126._12_4_;
          auVar166._0_4_ = fVar218 * auVar126._16_4_;
          auVar166._4_4_ = fVar218 * auVar126._20_4_;
          auVar166._8_4_ = fVar218 * auVar126._24_4_;
          auVar166._12_4_ = fVar218 * auVar126._28_4_;
          auVar86 = vsubps_avx((undefined1  [16])0x0,auVar166);
          auVar88 = vshufpd_avx(auVar91,auVar91,3);
          auVar92 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar79 = vsubps_avx(auVar88,auVar91);
          auVar75 = vsubps_avx(auVar92,(undefined1  [16])0x0);
          auVar203._0_4_ = auVar79._0_4_ + auVar75._0_4_;
          auVar203._4_4_ = auVar79._4_4_ + auVar75._4_4_;
          auVar203._8_4_ = auVar79._8_4_ + auVar75._8_4_;
          auVar203._12_4_ = auVar79._12_4_ + auVar75._12_4_;
          auVar79 = vshufps_avx(auVar91,auVar91,0xb1);
          auVar75 = vshufps_avx(auVar183,auVar183,0xb1);
          auVar76 = vshufps_avx(auVar86,auVar86,0xb1);
          auVar77 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar252._4_4_ = auVar203._0_4_;
          auVar252._0_4_ = auVar203._0_4_;
          auVar252._8_4_ = auVar203._0_4_;
          auVar252._12_4_ = auVar203._0_4_;
          auVar82 = vshufps_avx(auVar203,auVar203,0x55);
          fVar218 = auVar82._0_4_;
          auVar213._0_4_ = auVar79._0_4_ * fVar218;
          fVar227 = auVar82._4_4_;
          auVar213._4_4_ = auVar79._4_4_ * fVar227;
          fVar228 = auVar82._8_4_;
          auVar213._8_4_ = auVar79._8_4_ * fVar228;
          fVar229 = auVar82._12_4_;
          auVar213._12_4_ = auVar79._12_4_ * fVar229;
          auVar220._0_4_ = auVar75._0_4_ * fVar218;
          auVar220._4_4_ = auVar75._4_4_ * fVar227;
          auVar220._8_4_ = auVar75._8_4_ * fVar228;
          auVar220._12_4_ = auVar75._12_4_ * fVar229;
          auVar232._0_4_ = auVar76._0_4_ * fVar218;
          auVar232._4_4_ = auVar76._4_4_ * fVar227;
          auVar232._8_4_ = auVar76._8_4_ * fVar228;
          auVar232._12_4_ = auVar76._12_4_ * fVar229;
          auVar204._0_4_ = auVar77._0_4_ * fVar218;
          auVar204._4_4_ = auVar77._4_4_ * fVar227;
          auVar204._8_4_ = auVar77._8_4_ * fVar228;
          auVar204._12_4_ = auVar77._12_4_ * fVar229;
          auVar79 = vfmadd231ps_fma(auVar213,auVar252,auVar91);
          auVar75 = vfmadd231ps_fma(auVar220,auVar252,auVar183);
          auVar84 = vfmadd231ps_fma(auVar232,auVar252,auVar86);
          auVar85 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar252);
          auVar82 = vshufpd_avx(auVar79,auVar79,1);
          auVar83 = vshufpd_avx(auVar75,auVar75,1);
          auVar128._16_48_ = auVar126._16_48_;
          auVar80 = vshufpd_avx512vl(auVar84,auVar84,1);
          auVar81 = vshufpd_avx512vl(auVar85,auVar85,1);
          auVar76 = vminss_avx(auVar79,auVar75);
          auVar79 = vmaxss_avx(auVar75,auVar79);
          auVar77 = vminss_avx(auVar84,auVar85);
          auVar75 = vmaxss_avx(auVar85,auVar84);
          auVar76 = vminss_avx(auVar76,auVar77);
          auVar79 = vmaxss_avx(auVar75,auVar79);
          auVar77 = vminss_avx(auVar82,auVar83);
          auVar75 = vmaxss_avx(auVar83,auVar82);
          auVar82 = vminss_avx512f(auVar80,auVar81);
          auVar83 = vmaxss_avx512f(auVar81,auVar80);
          auVar75 = vmaxss_avx(auVar83,auVar75);
          auVar128._0_16_ = vminss_avx512f(auVar77,auVar82);
          fVar227 = auVar75._0_4_;
          fVar218 = auVar79._0_4_;
          if (auVar76._0_4_ < 0.0001) {
            bVar64 = fVar227 == -0.0001;
            bVar61 = NAN(fVar227);
            if (fVar227 <= -0.0001) goto LAB_019cac2c;
            break;
          }
LAB_019cac2c:
          vucomiss_avx512f(auVar128._0_16_);
          bVar64 = fVar227 <= -0.0001;
          bVar62 = -0.0001 < fVar218;
          bVar61 = bVar64;
          if (!bVar64) break;
          uVar24 = vcmpps_avx512vl(auVar76,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar25 = vcmpps_avx512vl(auVar128._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar53 = (uint)uVar24 & (uint)uVar25;
          bVar13 = (uVar53 & 1) == 0;
          bVar64 = bVar62 && bVar13;
          bVar61 = bVar62 && (uVar53 & 1) == 0;
        } while (!bVar62 || !bVar13);
        auVar83 = vxorps_avx512vl(auVar269._0_16_,auVar269._0_16_);
        auVar269 = ZEXT1664(auVar83);
        vcmpss_avx512f(auVar76,auVar83,1);
        uVar24 = vcmpss_avx512f(auVar79,auVar83,1);
        bVar62 = (bool)((byte)uVar24 & 1);
        auVar115._16_48_ = auVar128._16_48_;
        auVar115._0_16_ = auVar270._0_16_;
        auVar114._4_60_ = auVar115._4_60_;
        auVar114._0_4_ = (float)((uint)bVar62 * -0x40800000 + (uint)!bVar62 * auVar270._0_4_);
        vucomiss_avx512f(auVar114._0_16_);
        bVar61 = (bool)(!bVar64 | bVar61);
        bVar62 = bVar61 == false;
        auVar117._16_48_ = auVar128._16_48_;
        auVar117._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar116._4_60_ = auVar117._4_60_;
        auVar116._0_4_ = (uint)bVar61 * auVar83._0_4_ + (uint)!bVar61 * 0x7f800000;
        auVar82 = auVar116._0_16_;
        auVar119._16_48_ = auVar128._16_48_;
        auVar119._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar118._4_60_ = auVar119._4_60_;
        auVar118._0_4_ = (uint)bVar61 * auVar83._0_4_ + (uint)!bVar61 * -0x800000;
        auVar77 = auVar118._0_16_;
        auVar84 = vxorps_avx512vl(auVar268._0_16_,auVar268._0_16_);
        auVar268 = ZEXT1664(auVar84);
        uVar24 = vcmpss_avx512f(auVar128._0_16_,auVar83,1);
        bVar64 = (bool)((byte)uVar24 & 1);
        auVar121._16_48_ = auVar128._16_48_;
        auVar121._0_16_ = auVar270._0_16_;
        auVar120._4_60_ = auVar121._4_60_;
        auVar120._0_4_ = (float)((uint)bVar64 * -0x40800000 + (uint)!bVar64 * auVar270._0_4_);
        vucomiss_avx512f(auVar120._0_16_);
        if ((bVar61) || (bVar62)) {
          auVar83 = vucomiss_avx512f(auVar76);
          if ((bVar61) || (bVar62)) {
            auVar85 = vxorps_avx512vl(auVar76,auVar262._0_16_);
            auVar76 = vsubss_avx512f(auVar83,auVar76);
            auVar76 = vdivss_avx512f(auVar85,auVar76);
            auVar83 = vsubss_avx512f(ZEXT416(0x3f800000),auVar76);
            auVar83 = vfmadd213ss_avx512f(auVar83,auVar84,auVar76);
            auVar76 = auVar83;
          }
          else {
            auVar76 = vxorps_avx512vl(auVar83,auVar83);
            vucomiss_avx512f(auVar76);
            auVar83 = ZEXT416(0x3f800000);
            if ((bVar61) || (bVar62)) {
              auVar83 = SUB6416(ZEXT464(0xff800000),0);
              auVar76 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar82 = vminss_avx512f(auVar82,auVar76);
          auVar77 = vmaxss_avx(auVar83,auVar77);
        }
        auVar270 = ZEXT464(0x3f800000);
        uVar24 = vcmpss_avx512f(auVar75,auVar84,1);
        bVar64 = (bool)((byte)uVar24 & 1);
        auVar75 = auVar270._0_16_;
        fVar228 = (float)((uint)bVar64 * -0x40800000 + (uint)!bVar64 * 0x3f800000);
        if ((auVar114._0_4_ != fVar228) || (NAN(auVar114._0_4_) || NAN(fVar228))) {
          if ((fVar227 != fVar218) || (NAN(fVar227) || NAN(fVar218))) {
            auVar79 = vxorps_avx512vl(auVar79,auVar262._0_16_);
            auVar205._0_4_ = auVar79._0_4_ / (fVar227 - fVar218);
            auVar205._4_12_ = auVar79._4_12_;
            auVar79 = vsubss_avx512f(auVar75,auVar205);
            auVar79 = vfmadd213ss_avx512f(auVar79,auVar84,auVar205);
            auVar76 = auVar79;
          }
          else if ((fVar218 != 0.0) ||
                  (auVar79 = auVar75, auVar76 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar218))) {
            auVar79 = SUB6416(ZEXT464(0xff800000),0);
            auVar76 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar82 = vminss_avx(auVar82,auVar76);
          auVar77 = vmaxss_avx(auVar79,auVar77);
        }
        bVar64 = auVar120._0_4_ != fVar228;
        auVar79 = vminss_avx512f(auVar82,auVar75);
        auVar123._16_48_ = auVar128._16_48_;
        auVar123._0_16_ = auVar82;
        auVar122._4_60_ = auVar123._4_60_;
        auVar122._0_4_ = (uint)bVar64 * auVar79._0_4_ + (uint)!bVar64 * auVar82._0_4_;
        auVar79 = vmaxss_avx512f(auVar75,auVar77);
        auVar125._16_48_ = auVar128._16_48_;
        auVar125._0_16_ = auVar77;
        auVar124._4_60_ = auVar125._4_60_;
        auVar124._0_4_ = (uint)bVar64 * auVar79._0_4_ + (uint)!bVar64 * auVar77._0_4_;
        auVar79 = vmaxss_avx512f(auVar84,auVar122._0_16_);
        auVar128._0_16_ = vminss_avx512f(auVar124._0_16_,auVar75);
      } while (auVar128._0_4_ < auVar79._0_4_);
      auVar85 = vmaxss_avx512f(auVar84,ZEXT416((uint)(auVar79._0_4_ + -0.1)));
      auVar81 = vminss_avx512f(ZEXT416((uint)(auVar128._0_4_ + 0.1)),auVar75);
      auVar149._0_8_ = auVar91._0_8_;
      auVar149._8_8_ = auVar149._0_8_;
      auVar221._8_8_ = auVar183._0_8_;
      auVar221._0_8_ = auVar183._0_8_;
      auVar233._8_8_ = auVar86._0_8_;
      auVar233._0_8_ = auVar86._0_8_;
      auVar79 = vshufpd_avx(auVar183,auVar183,3);
      auVar76 = vshufpd_avx(auVar86,auVar86,3);
      auVar77 = vshufps_avx(auVar85,auVar81,0);
      auVar83 = vsubps_avx512vl(auVar78,auVar77);
      fVar218 = auVar77._0_4_;
      auVar175._0_4_ = fVar218 * auVar88._0_4_;
      fVar227 = auVar77._4_4_;
      auVar175._4_4_ = fVar227 * auVar88._4_4_;
      fVar228 = auVar77._8_4_;
      auVar175._8_4_ = fVar228 * auVar88._8_4_;
      fVar229 = auVar77._12_4_;
      auVar175._12_4_ = fVar229 * auVar88._12_4_;
      auVar184._0_4_ = fVar218 * auVar79._0_4_;
      auVar184._4_4_ = fVar227 * auVar79._4_4_;
      auVar184._8_4_ = fVar228 * auVar79._8_4_;
      auVar184._12_4_ = fVar229 * auVar79._12_4_;
      auVar255._0_4_ = auVar76._0_4_ * fVar218;
      auVar255._4_4_ = auVar76._4_4_ * fVar227;
      auVar255._8_4_ = auVar76._8_4_ * fVar228;
      auVar255._12_4_ = auVar76._12_4_ * fVar229;
      auVar167._0_4_ = fVar218 * auVar92._0_4_;
      auVar167._4_4_ = fVar227 * auVar92._4_4_;
      auVar167._8_4_ = fVar228 * auVar92._8_4_;
      auVar167._12_4_ = fVar229 * auVar92._12_4_;
      auVar88 = vfmadd231ps_fma(auVar175,auVar83,auVar149);
      auVar92 = vfmadd231ps_fma(auVar184,auVar83,auVar221);
      auVar82 = vfmadd231ps_fma(auVar255,auVar83,auVar233);
      auVar83 = vfmadd231ps_fma(auVar167,auVar83,ZEXT816(0));
      auVar76 = vsubss_avx512f(auVar75,auVar85);
      auVar79 = vmovshdup_avx(auVar66);
      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar85._0_4_)),auVar66,auVar76);
      auVar76 = vsubss_avx512f(auVar75,auVar81);
      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar81._0_4_)),auVar66,auVar76);
      auVar86 = vdivss_avx512f(auVar75,ZEXT416((uint)fVar129));
      auVar66 = vsubps_avx(auVar92,auVar88);
      auVar180 = auVar134._0_16_;
      auVar76 = vmulps_avx512vl(auVar66,auVar180);
      auVar66 = vsubps_avx(auVar82,auVar92);
      auVar77 = vmulps_avx512vl(auVar66,auVar180);
      auVar66 = vsubps_avx(auVar83,auVar82);
      auVar66 = vmulps_avx512vl(auVar66,auVar180);
      auVar79 = vminps_avx(auVar77,auVar66);
      auVar66 = vmaxps_avx(auVar77,auVar66);
      auVar79 = vminps_avx(auVar76,auVar79);
      auVar66 = vmaxps_avx(auVar76,auVar66);
      auVar76 = vshufpd_avx(auVar79,auVar79,3);
      auVar77 = vshufpd_avx(auVar66,auVar66,3);
      auVar79 = vminps_avx(auVar79,auVar76);
      auVar66 = vmaxps_avx(auVar66,auVar77);
      fVar129 = auVar86._0_4_;
      auVar206._0_4_ = auVar79._0_4_ * fVar129;
      auVar206._4_4_ = auVar79._4_4_ * fVar129;
      auVar206._8_4_ = auVar79._8_4_ * fVar129;
      auVar206._12_4_ = auVar79._12_4_ * fVar129;
      auVar192._0_4_ = fVar129 * auVar66._0_4_;
      auVar192._4_4_ = fVar129 * auVar66._4_4_;
      auVar192._8_4_ = fVar129 * auVar66._8_4_;
      auVar192._12_4_ = fVar129 * auVar66._12_4_;
      auVar86 = vdivss_avx512f(auVar75,ZEXT416((uint)(auVar81._0_4_ - auVar80._0_4_)));
      auVar66 = vshufpd_avx(auVar88,auVar88,3);
      auVar79 = vshufpd_avx(auVar92,auVar92,3);
      auVar76 = vshufpd_avx(auVar82,auVar82,3);
      auVar77 = vshufpd_avx(auVar83,auVar83,3);
      auVar66 = vsubps_avx(auVar66,auVar88);
      auVar88 = vsubps_avx(auVar79,auVar92);
      auVar92 = vsubps_avx(auVar76,auVar82);
      auVar77 = vsubps_avx(auVar77,auVar83);
      auVar79 = vminps_avx(auVar66,auVar88);
      auVar66 = vmaxps_avx(auVar66,auVar88);
      auVar76 = vminps_avx(auVar92,auVar77);
      auVar76 = vminps_avx(auVar79,auVar76);
      auVar79 = vmaxps_avx(auVar92,auVar77);
      auVar66 = vmaxps_avx(auVar66,auVar79);
      fVar129 = auVar86._0_4_;
      auVar234._0_4_ = fVar129 * auVar76._0_4_;
      auVar234._4_4_ = fVar129 * auVar76._4_4_;
      auVar234._8_4_ = fVar129 * auVar76._8_4_;
      auVar234._12_4_ = fVar129 * auVar76._12_4_;
      auVar222._0_4_ = fVar129 * auVar66._0_4_;
      auVar222._4_4_ = fVar129 * auVar66._4_4_;
      auVar222._8_4_ = fVar129 * auVar66._8_4_;
      auVar222._12_4_ = fVar129 * auVar66._12_4_;
      auVar77 = vinsertps_avx(auVar73,auVar80,0x10);
      auVar87 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9f90,auVar81);
      auVar141._0_4_ = auVar77._0_4_ + auVar87._0_4_;
      auVar141._4_4_ = auVar77._4_4_ + auVar87._4_4_;
      auVar141._8_4_ = auVar77._8_4_ + auVar87._8_4_;
      auVar141._12_4_ = auVar77._12_4_ + auVar87._12_4_;
      auVar28._8_4_ = 0x3f000000;
      auVar28._0_8_ = 0x3f0000003f000000;
      auVar28._12_4_ = 0x3f000000;
      auVar86 = vmulps_avx512vl(auVar141,auVar28);
      auVar79 = vshufps_avx(auVar86,auVar86,0x54);
      uVar138 = auVar86._0_4_;
      auVar143._4_4_ = uVar138;
      auVar143._0_4_ = uVar138;
      auVar143._8_4_ = uVar138;
      auVar143._12_4_ = uVar138;
      auVar76 = vfmadd213ps_fma(auVar65,auVar143,auVar72);
      auVar88 = vfmadd213ps_fma(local_470,auVar143,auVar71);
      auVar92 = vfmadd213ps_fma(local_480,auVar143,auVar4);
      auVar66 = vsubps_avx(auVar88,auVar76);
      auVar76 = vfmadd213ps_fma(auVar66,auVar143,auVar76);
      auVar66 = vsubps_avx(auVar92,auVar88);
      auVar66 = vfmadd213ps_fma(auVar66,auVar143,auVar88);
      auVar66 = vsubps_avx(auVar66,auVar76);
      auVar76 = vfmadd231ps_fma(auVar76,auVar66,auVar143);
      auVar82 = vmulps_avx512vl(auVar66,auVar180);
      auVar245._8_8_ = auVar76._0_8_;
      auVar245._0_8_ = auVar76._0_8_;
      auVar66 = vshufpd_avx(auVar76,auVar76,3);
      auVar76 = vshufps_avx(auVar86,auVar86,0x55);
      auVar88 = vsubps_avx(auVar66,auVar245);
      auVar92 = vfmadd231ps_fma(auVar245,auVar76,auVar88);
      auVar256._8_8_ = auVar82._0_8_;
      auVar256._0_8_ = auVar82._0_8_;
      auVar66 = vshufpd_avx(auVar82,auVar82,3);
      auVar66 = vsubps_avx512vl(auVar66,auVar256);
      auVar66 = vfmadd213ps_avx512vl(auVar66,auVar76,auVar256);
      auVar144._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
      auVar144._8_4_ = auVar88._8_4_ ^ 0x80000000;
      auVar144._12_4_ = auVar88._12_4_ ^ 0x80000000;
      auVar76 = vmovshdup_avx512vl(auVar66);
      auVar257._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
      auVar257._8_4_ = auVar76._8_4_ ^ 0x80000000;
      auVar257._12_4_ = auVar76._12_4_ ^ 0x80000000;
      auVar82 = vmovshdup_avx512vl(auVar88);
      auVar83 = vpermt2ps_avx512vl(auVar257,ZEXT416(5),auVar88);
      auVar269 = ZEXT464(0x40400000);
      auVar76 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar76._0_4_ * auVar88._0_4_)),auVar66,auVar82);
      auVar88 = vpermt2ps_avx512vl(auVar66,SUB6416(ZEXT464(4),0),auVar144);
      auVar168._0_4_ = auVar76._0_4_;
      auVar168._4_4_ = auVar168._0_4_;
      auVar168._8_4_ = auVar168._0_4_;
      auVar168._12_4_ = auVar168._0_4_;
      auVar66 = vdivps_avx(auVar83,auVar168);
      auVar89 = vdivps_avx512vl(auVar88,auVar168);
      fVar129 = auVar92._0_4_;
      auVar76 = vshufps_avx(auVar92,auVar92,0x55);
      auVar246._0_4_ = fVar129 * auVar66._0_4_ + auVar76._0_4_ * auVar89._0_4_;
      auVar246._4_4_ = fVar129 * auVar66._4_4_ + auVar76._4_4_ * auVar89._4_4_;
      auVar246._8_4_ = fVar129 * auVar66._8_4_ + auVar76._8_4_ * auVar89._8_4_;
      auVar246._12_4_ = fVar129 * auVar66._12_4_ + auVar76._12_4_ * auVar89._12_4_;
      auVar85 = vsubps_avx(auVar79,auVar246);
      auVar76 = vmovshdup_avx(auVar66);
      auVar79 = vinsertps_avx(auVar206,auVar234,0x1c);
      auVar258._0_4_ = auVar76._0_4_ * auVar79._0_4_;
      auVar258._4_4_ = auVar76._4_4_ * auVar79._4_4_;
      auVar258._8_4_ = auVar76._8_4_ * auVar79._8_4_;
      auVar258._12_4_ = auVar76._12_4_ * auVar79._12_4_;
      auVar91 = vinsertps_avx512f(auVar192,auVar222,0x1c);
      auVar76 = vmulps_avx512vl(auVar76,auVar91);
      auVar83 = vminps_avx512vl(auVar258,auVar76);
      auVar92 = vmaxps_avx(auVar76,auVar258);
      auVar82 = vmovshdup_avx(auVar89);
      auVar76 = vinsertps_avx(auVar234,auVar206,0x4c);
      auVar235._0_4_ = auVar82._0_4_ * auVar76._0_4_;
      auVar235._4_4_ = auVar82._4_4_ * auVar76._4_4_;
      auVar235._8_4_ = auVar82._8_4_ * auVar76._8_4_;
      auVar235._12_4_ = auVar82._12_4_ * auVar76._12_4_;
      auVar88 = vinsertps_avx(auVar222,auVar192,0x4c);
      auVar223._0_4_ = auVar82._0_4_ * auVar88._0_4_;
      auVar223._4_4_ = auVar82._4_4_ * auVar88._4_4_;
      auVar223._8_4_ = auVar82._8_4_ * auVar88._8_4_;
      auVar223._12_4_ = auVar82._12_4_ * auVar88._12_4_;
      auVar82 = vminps_avx(auVar235,auVar223);
      auVar83 = vaddps_avx512vl(auVar83,auVar82);
      auVar82 = vmaxps_avx(auVar223,auVar235);
      auVar224._0_4_ = auVar92._0_4_ + auVar82._0_4_;
      auVar224._4_4_ = auVar92._4_4_ + auVar82._4_4_;
      auVar224._8_4_ = auVar92._8_4_ + auVar82._8_4_;
      auVar224._12_4_ = auVar92._12_4_ + auVar82._12_4_;
      auVar236._8_8_ = 0x3f80000000000000;
      auVar236._0_8_ = 0x3f80000000000000;
      auVar92 = vsubps_avx(auVar236,auVar224);
      auVar82 = vsubps_avx(auVar236,auVar83);
      auVar83 = vsubps_avx(auVar77,auVar86);
      auVar86 = vsubps_avx(auVar87,auVar86);
      fVar229 = auVar83._0_4_;
      auVar259._0_4_ = fVar229 * auVar92._0_4_;
      fVar240 = auVar83._4_4_;
      auVar259._4_4_ = fVar240 * auVar92._4_4_;
      fVar241 = auVar83._8_4_;
      auVar259._8_4_ = fVar241 * auVar92._8_4_;
      fVar242 = auVar83._12_4_;
      auVar259._12_4_ = fVar242 * auVar92._12_4_;
      auVar90 = vbroadcastss_avx512vl(auVar66);
      auVar79 = vmulps_avx512vl(auVar90,auVar79);
      auVar91 = vmulps_avx512vl(auVar90,auVar91);
      auVar90 = vminps_avx512vl(auVar79,auVar91);
      auVar91 = vmaxps_avx512vl(auVar91,auVar79);
      auVar79 = vbroadcastss_avx512vl(auVar89);
      auVar76 = vmulps_avx512vl(auVar79,auVar76);
      auVar79 = vmulps_avx512vl(auVar79,auVar88);
      auVar88 = vminps_avx512vl(auVar76,auVar79);
      auVar88 = vaddps_avx512vl(auVar90,auVar88);
      auVar83 = vmulps_avx512vl(auVar83,auVar82);
      fVar129 = auVar86._0_4_;
      auVar225._0_4_ = fVar129 * auVar92._0_4_;
      fVar218 = auVar86._4_4_;
      auVar225._4_4_ = fVar218 * auVar92._4_4_;
      fVar227 = auVar86._8_4_;
      auVar225._8_4_ = fVar227 * auVar92._8_4_;
      fVar228 = auVar86._12_4_;
      auVar225._12_4_ = fVar228 * auVar92._12_4_;
      auVar237._0_4_ = fVar129 * auVar82._0_4_;
      auVar237._4_4_ = fVar218 * auVar82._4_4_;
      auVar237._8_4_ = fVar227 * auVar82._8_4_;
      auVar237._12_4_ = fVar228 * auVar82._12_4_;
      auVar79 = vmaxps_avx(auVar79,auVar76);
      auVar193._0_4_ = auVar91._0_4_ + auVar79._0_4_;
      auVar193._4_4_ = auVar91._4_4_ + auVar79._4_4_;
      auVar193._8_4_ = auVar91._8_4_ + auVar79._8_4_;
      auVar193._12_4_ = auVar91._12_4_ + auVar79._12_4_;
      auVar207._8_8_ = 0x3f800000;
      auVar207._0_8_ = 0x3f800000;
      auVar79 = vsubps_avx(auVar207,auVar193);
      auVar76 = vsubps_avx512vl(auVar207,auVar88);
      auVar253._0_4_ = fVar229 * auVar79._0_4_;
      auVar253._4_4_ = fVar240 * auVar79._4_4_;
      auVar253._8_4_ = fVar241 * auVar79._8_4_;
      auVar253._12_4_ = fVar242 * auVar79._12_4_;
      auVar247._0_4_ = fVar229 * auVar76._0_4_;
      auVar247._4_4_ = fVar240 * auVar76._4_4_;
      auVar247._8_4_ = fVar241 * auVar76._8_4_;
      auVar247._12_4_ = fVar242 * auVar76._12_4_;
      auVar194._0_4_ = fVar129 * auVar79._0_4_;
      auVar194._4_4_ = fVar218 * auVar79._4_4_;
      auVar194._8_4_ = fVar227 * auVar79._8_4_;
      auVar194._12_4_ = fVar228 * auVar79._12_4_;
      auVar208._0_4_ = fVar129 * auVar76._0_4_;
      auVar208._4_4_ = fVar218 * auVar76._4_4_;
      auVar208._8_4_ = fVar227 * auVar76._8_4_;
      auVar208._12_4_ = fVar228 * auVar76._12_4_;
      auVar79 = vminps_avx(auVar253,auVar247);
      auVar76 = vminps_avx512vl(auVar194,auVar208);
      auVar88 = vminps_avx512vl(auVar79,auVar76);
      auVar79 = vmaxps_avx(auVar247,auVar253);
      auVar76 = vmaxps_avx(auVar208,auVar194);
      auVar76 = vmaxps_avx(auVar76,auVar79);
      auVar92 = vminps_avx512vl(auVar259,auVar83);
      auVar79 = vminps_avx(auVar225,auVar237);
      auVar79 = vminps_avx(auVar92,auVar79);
      auVar79 = vhaddps_avx(auVar88,auVar79);
      auVar128._0_16_ = vmaxps_avx512vl(auVar83,auVar259);
      auVar88 = vmaxps_avx(auVar237,auVar225);
      auVar88 = vmaxps_avx(auVar88,auVar128._0_16_);
      auVar76 = vhaddps_avx(auVar76,auVar88);
      auVar79 = vshufps_avx(auVar79,auVar79,0xe8);
      auVar76 = vshufps_avx(auVar76,auVar76,0xe8);
      auVar195._0_4_ = auVar79._0_4_ + auVar85._0_4_;
      auVar195._4_4_ = auVar79._4_4_ + auVar85._4_4_;
      auVar195._8_4_ = auVar79._8_4_ + auVar85._8_4_;
      auVar195._12_4_ = auVar79._12_4_ + auVar85._12_4_;
      auVar209._0_4_ = auVar76._0_4_ + auVar85._0_4_;
      auVar209._4_4_ = auVar76._4_4_ + auVar85._4_4_;
      auVar209._8_4_ = auVar76._8_4_ + auVar85._8_4_;
      auVar209._12_4_ = auVar76._12_4_ + auVar85._12_4_;
      auVar79 = vmaxps_avx(auVar77,auVar195);
      auVar76 = vminps_avx(auVar209,auVar87);
      uVar60 = vcmpps_avx512vl(auVar76,auVar79,1);
    } while ((uVar60 & 3) != 0);
    uVar60 = vcmpps_avx512vl(auVar209,auVar87,1);
    uVar24 = vcmpps_avx512vl(auVar73,auVar195,1);
    if (((ushort)uVar24 & (ushort)uVar60 & 1) == 0) {
      bVar52 = 0;
    }
    else {
      auVar79 = vmovshdup_avx(auVar195);
      bVar52 = auVar80._0_4_ < auVar79._0_4_ & (byte)(uVar60 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar54 || uVar8 != 0 && !bVar63) | bVar52) == 1) {
      lVar56 = 0xc9;
      do {
        lVar56 = lVar56 + -1;
        if (lVar56 == 0) goto LAB_019ca9f4;
        auVar73 = vsubss_avx512f(auVar75,auVar85);
        fVar227 = auVar73._0_4_;
        fVar129 = fVar227 * fVar227 * fVar227;
        auVar73 = vmulss_avx512f(auVar85,ZEXT416(0x40400000));
        fVar218 = auVar73._0_4_ * fVar227 * fVar227;
        fVar228 = auVar85._0_4_;
        auVar73 = vmulss_avx512f(ZEXT416((uint)(fVar228 * fVar228)),ZEXT416(0x40400000));
        fVar227 = fVar227 * auVar73._0_4_;
        auVar157._4_4_ = fVar129;
        auVar157._0_4_ = fVar129;
        auVar157._8_4_ = fVar129;
        auVar157._12_4_ = fVar129;
        auVar150._4_4_ = fVar218;
        auVar150._0_4_ = fVar218;
        auVar150._8_4_ = fVar218;
        auVar150._12_4_ = fVar218;
        auVar131._4_4_ = fVar227;
        auVar131._0_4_ = fVar227;
        auVar131._8_4_ = fVar227;
        auVar131._12_4_ = fVar227;
        fVar228 = fVar228 * fVar228 * fVar228;
        auVar176._0_4_ = (float)local_490._0_4_ * fVar228;
        auVar176._4_4_ = (float)local_490._4_4_ * fVar228;
        auVar176._8_4_ = fStack_488 * fVar228;
        auVar176._12_4_ = fStack_484 * fVar228;
        auVar73 = vfmadd231ps_fma(auVar176,auVar4,auVar131);
        auVar73 = vfmadd231ps_fma(auVar73,auVar71,auVar150);
        auVar73 = vfmadd231ps_fma(auVar73,auVar72,auVar157);
        auVar132._8_8_ = auVar73._0_8_;
        auVar132._0_8_ = auVar73._0_8_;
        auVar73 = vshufpd_avx(auVar73,auVar73,3);
        auVar79 = vshufps_avx(auVar85,auVar85,0x55);
        auVar73 = vsubps_avx(auVar73,auVar132);
        auVar79 = vfmadd213ps_fma(auVar73,auVar79,auVar132);
        fVar129 = auVar79._0_4_;
        auVar73 = vshufps_avx(auVar79,auVar79,0x55);
        auVar133._0_4_ = auVar66._0_4_ * fVar129 + auVar89._0_4_ * auVar73._0_4_;
        auVar133._4_4_ = auVar66._4_4_ * fVar129 + auVar89._4_4_ * auVar73._4_4_;
        auVar133._8_4_ = auVar66._8_4_ * fVar129 + auVar89._8_4_ * auVar73._8_4_;
        auVar133._12_4_ = auVar66._12_4_ * fVar129 + auVar89._12_4_ * auVar73._12_4_;
        auVar85 = vsubps_avx(auVar85,auVar133);
        auVar73 = vandps_avx512vl(auVar79,auVar261._0_16_);
        auVar128._0_16_ = vprolq_avx512vl(auVar73,0x20);
        auVar73 = vmaxss_avx(auVar128._0_16_,auVar73);
        bVar63 = auVar73._0_4_ <= (float)local_4a0._0_4_;
      } while ((float)local_4a0._0_4_ <= auVar73._0_4_);
      auVar73 = vucomiss_avx512f(auVar84);
      if (bVar63) {
        auVar66 = vucomiss_avx512f(auVar73);
        auVar270 = ZEXT1664(auVar66);
        if (bVar63) {
          vmovshdup_avx(auVar73);
          auVar66 = vucomiss_avx512f(auVar84);
          if (bVar63) {
            auVar79 = vucomiss_avx512f(auVar66);
            auVar270 = ZEXT1664(auVar79);
            if (bVar63) {
              auVar75 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar86 = vinsertps_avx(auVar75,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar75 = vdpps_avx(auVar86,local_4b0,0x7f);
              auVar76 = vdpps_avx(auVar86,local_4c0,0x7f);
              auVar77 = vdpps_avx(auVar86,local_4d0,0x7f);
              auVar88 = vdpps_avx(auVar86,local_4e0,0x7f);
              auVar92 = vdpps_avx(auVar86,local_4f0,0x7f);
              auVar82 = vdpps_avx(auVar86,local_500,0x7f);
              auVar83 = vdpps_avx(auVar86,local_510,0x7f);
              auVar86 = vdpps_avx(auVar86,local_520,0x7f);
              auVar84 = vsubss_avx512f(auVar79,auVar66);
              fVar229 = auVar66._0_4_;
              auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar92._0_4_)),auVar84,auVar75);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ * fVar229)),auVar84,auVar76);
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ * fVar229)),auVar84,auVar77);
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar86._0_4_)),auVar84,auVar88);
              auVar79 = vsubss_avx512f(auVar79,auVar73);
              auVar185._0_4_ = auVar79._0_4_;
              fVar218 = auVar185._0_4_ * auVar185._0_4_ * auVar185._0_4_;
              auVar79 = vmulss_avx512f(auVar73,ZEXT416(0x40400000));
              fVar227 = auVar79._0_4_ * auVar185._0_4_ * auVar185._0_4_;
              fVar129 = auVar73._0_4_;
              auVar177._0_4_ = fVar129 * fVar129;
              auVar177._4_4_ = auVar73._4_4_ * auVar73._4_4_;
              auVar177._8_4_ = auVar73._8_4_ * auVar73._8_4_;
              auVar177._12_4_ = auVar73._12_4_ * auVar73._12_4_;
              auVar128._0_16_ = vmulss_avx512f(auVar177,ZEXT416(0x40400000));
              fVar228 = auVar185._0_4_ * auVar128._0_4_;
              fVar241 = fVar129 * auVar177._0_4_;
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * auVar77._0_4_)),
                                        ZEXT416((uint)fVar228),auVar76);
              auVar79 = vfmadd231ss_fma(auVar79,ZEXT416((uint)fVar227),auVar75);
              auVar66 = vfmadd231ss_fma(auVar79,ZEXT416((uint)fVar218),auVar66);
              fVar240 = auVar66._0_4_;
              if ((fVar1 <= fVar240) &&
                 (fVar242 = *(float *)(ray + k * 4 + 0x200), fVar240 <= fVar242)) {
                auVar66 = vshufps_avx(auVar73,auVar73,0x55);
                auVar75 = vsubps_avx512vl(auVar78,auVar66);
                fVar243 = auVar66._0_4_;
                auVar214._0_4_ = fVar243 * (float)local_540._0_4_;
                fVar248 = auVar66._4_4_;
                auVar214._4_4_ = fVar248 * (float)local_540._4_4_;
                fVar249 = auVar66._8_4_;
                auVar214._8_4_ = fVar249 * fStack_538;
                fVar250 = auVar66._12_4_;
                auVar214._12_4_ = fVar250 * fStack_534;
                auVar226._0_4_ = fVar243 * (float)local_590._0_4_;
                auVar226._4_4_ = fVar248 * (float)local_590._4_4_;
                auVar226._8_4_ = fVar249 * fStack_588;
                auVar226._12_4_ = fVar250 * fStack_584;
                auVar238._0_4_ = fVar243 * (float)local_5a0._0_4_;
                auVar238._4_4_ = fVar248 * (float)local_5a0._4_4_;
                auVar238._8_4_ = fVar249 * fStack_598;
                auVar238._12_4_ = fVar250 * fStack_594;
                auVar196._0_4_ = fVar243 * (float)local_560._0_4_;
                auVar196._4_4_ = fVar248 * (float)local_560._4_4_;
                auVar196._8_4_ = fVar249 * fStack_558;
                auVar196._12_4_ = fVar250 * fStack_554;
                auVar66 = vfmadd231ps_fma(auVar214,auVar75,local_530);
                auVar79 = vfmadd231ps_fma(auVar226,auVar75,local_570);
                auVar78 = vfmadd231ps_fma(auVar238,auVar75,local_580);
                auVar75 = vfmadd231ps_fma(auVar196,auVar75,local_550);
                auVar66 = vsubps_avx(auVar79,auVar66);
                auVar79 = vsubps_avx(auVar78,auVar79);
                auVar78 = vsubps_avx(auVar75,auVar78);
                auVar239._0_4_ = fVar129 * auVar79._0_4_;
                auVar239._4_4_ = fVar129 * auVar79._4_4_;
                auVar239._8_4_ = fVar129 * auVar79._8_4_;
                auVar239._12_4_ = fVar129 * auVar79._12_4_;
                auVar185._4_4_ = auVar185._0_4_;
                auVar185._8_4_ = auVar185._0_4_;
                auVar185._12_4_ = auVar185._0_4_;
                auVar66 = vfmadd231ps_fma(auVar239,auVar185,auVar66);
                auVar197._0_4_ = fVar129 * auVar78._0_4_;
                auVar197._4_4_ = fVar129 * auVar78._4_4_;
                auVar197._8_4_ = fVar129 * auVar78._8_4_;
                auVar197._12_4_ = fVar129 * auVar78._12_4_;
                auVar79 = vfmadd231ps_fma(auVar197,auVar185,auVar79);
                auVar198._0_4_ = fVar129 * auVar79._0_4_;
                auVar198._4_4_ = fVar129 * auVar79._4_4_;
                auVar198._8_4_ = fVar129 * auVar79._8_4_;
                auVar198._12_4_ = fVar129 * auVar79._12_4_;
                auVar66 = vfmadd231ps_fma(auVar198,auVar185,auVar66);
                auVar128._0_16_ = vmulps_avx512vl(auVar66,auVar180);
                pGVar9 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar178._0_4_ = fVar241 * (float)local_5e0._0_4_;
                  auVar178._4_4_ = fVar241 * (float)local_5e0._4_4_;
                  auVar178._8_4_ = fVar241 * fStack_5d8;
                  auVar178._12_4_ = fVar241 * fStack_5d4;
                  auVar169._4_4_ = fVar228;
                  auVar169._0_4_ = fVar228;
                  auVar169._8_4_ = fVar228;
                  auVar169._12_4_ = fVar228;
                  auVar66 = vfmadd132ps_fma(auVar169,auVar178,local_5d0);
                  auVar158._4_4_ = fVar227;
                  auVar158._0_4_ = fVar227;
                  auVar158._8_4_ = fVar227;
                  auVar158._12_4_ = fVar227;
                  auVar66 = vfmadd132ps_fma(auVar158,auVar66,local_5c0);
                  auVar151._4_4_ = fVar218;
                  auVar151._0_4_ = fVar218;
                  auVar151._8_4_ = fVar218;
                  auVar151._12_4_ = fVar218;
                  auVar78 = vfmadd132ps_fma(auVar151,auVar66,local_5b0);
                  auVar66 = vshufps_avx(auVar78,auVar78,0xc9);
                  auVar79 = vshufps_avx(auVar128._0_16_,auVar128._0_16_,0xc9);
                  auVar152._0_4_ = auVar78._0_4_ * auVar79._0_4_;
                  auVar152._4_4_ = auVar78._4_4_ * auVar79._4_4_;
                  auVar152._8_4_ = auVar78._8_4_ * auVar79._8_4_;
                  auVar152._12_4_ = auVar78._12_4_ * auVar79._12_4_;
                  auVar66 = vfmsub231ps_fma(auVar152,auVar128._0_16_,auVar66);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar240;
                    uVar138 = vextractps_avx(auVar66,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar138;
                    uVar138 = vextractps_avx(auVar66,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar138;
                    *(int *)(ray + k * 4 + 0x380) = auVar66._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar129;
                    *(float *)(ray + k * 4 + 0x400) = fVar229;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar6;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    goto LAB_019ca9f4;
                  }
                  local_200 = vbroadcastss_avx512f(auVar73);
                  auVar126 = vbroadcastss_avx512f(ZEXT416(1));
                  local_1c0 = vpermps_avx512f(auVar126,ZEXT1664(auVar73));
                  auVar126 = vpermps_avx512f(auVar126,ZEXT1664(auVar66));
                  auVar127 = vbroadcastss_avx512f(ZEXT416(2));
                  local_280 = vpermps_avx512f(auVar127,ZEXT1664(auVar66));
                  local_240 = vbroadcastss_avx512f(auVar66);
                  local_2c0[0] = (RTCHitN)auVar126[0];
                  local_2c0[1] = (RTCHitN)auVar126[1];
                  local_2c0[2] = (RTCHitN)auVar126[2];
                  local_2c0[3] = (RTCHitN)auVar126[3];
                  local_2c0[4] = (RTCHitN)auVar126[4];
                  local_2c0[5] = (RTCHitN)auVar126[5];
                  local_2c0[6] = (RTCHitN)auVar126[6];
                  local_2c0[7] = (RTCHitN)auVar126[7];
                  local_2c0[8] = (RTCHitN)auVar126[8];
                  local_2c0[9] = (RTCHitN)auVar126[9];
                  local_2c0[10] = (RTCHitN)auVar126[10];
                  local_2c0[0xb] = (RTCHitN)auVar126[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar126[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar126[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar126[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar126[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar126[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar126[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar126[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar126[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar126[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar126[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar126[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar126[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar126[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar126[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar126[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar126[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar126[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar126[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar126[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar126[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar126[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar126[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar126[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar126[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar126[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar126[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar126[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar126[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar126[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar126[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar126[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar126[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar126[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar126[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar126[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar126[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar126[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar126[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar126[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar126[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar126[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar126[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar126[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar126[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar126[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar126[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar126[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar126[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar126[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar126[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar126[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar126[0x3f];
                  local_180 = local_340._0_8_;
                  uStack_178 = local_340._8_8_;
                  uStack_170 = local_340._16_8_;
                  uStack_168 = local_340._24_8_;
                  uStack_160 = local_340._32_8_;
                  uStack_158 = local_340._40_8_;
                  uStack_150 = local_340._48_8_;
                  uStack_148 = local_340._56_8_;
                  auVar126 = vmovdqa64_avx512f(local_300);
                  local_140 = vmovdqa64_avx512f(auVar126);
                  vpcmpeqd_avx2(auVar126._0_32_,auVar126._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar240;
                  auVar128 = vmovdqa64_avx512f(local_380);
                  local_400 = vmovdqa64_avx512f(auVar128);
                  local_620.valid = (int *)local_400;
                  local_620.geometryUserPtr = pGVar9->userPtr;
                  local_620.context = context->user;
                  local_620.hit = local_2c0;
                  local_620.N = 0x10;
                  local_620.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&local_620);
                    auVar270 = ZEXT464(0x3f800000);
                    auVar266 = ZEXT3264(_DAT_01fb9fe0);
                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar265 = ZEXT1664(auVar73);
                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar264 = ZEXT1664(auVar73);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar263 = ZEXT3264(auVar99);
                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar262 = ZEXT1664(auVar73);
                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar261 = ZEXT1664(auVar73);
                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar134 = ZEXT1664(auVar73);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
                    auVar267 = ZEXT3264(auVar99);
                    auVar128 = vmovdqa64_avx512f(local_400);
                  }
                  uVar24 = vptestmd_avx512f(auVar128,auVar128);
                  if ((short)uVar24 != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_620);
                      auVar270 = ZEXT464(0x3f800000);
                      auVar266 = ZEXT3264(_DAT_01fb9fe0);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar265 = ZEXT1664(auVar73);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar264 = ZEXT1664(auVar73);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar263 = ZEXT3264(auVar99);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar262 = ZEXT1664(auVar73);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar261 = ZEXT1664(auVar73);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar134 = ZEXT1664(auVar73);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar267 = ZEXT3264(auVar99);
                      auVar128 = vmovdqa64_avx512f(local_400);
                    }
                    uVar60 = vptestmd_avx512f(auVar128,auVar128);
                    if ((short)uVar60 != 0) {
                      iVar37 = *(int *)(local_620.hit + 4);
                      iVar38 = *(int *)(local_620.hit + 8);
                      iVar39 = *(int *)(local_620.hit + 0xc);
                      iVar40 = *(int *)(local_620.hit + 0x10);
                      iVar41 = *(int *)(local_620.hit + 0x14);
                      iVar42 = *(int *)(local_620.hit + 0x18);
                      iVar43 = *(int *)(local_620.hit + 0x1c);
                      iVar44 = *(int *)(local_620.hit + 0x20);
                      iVar45 = *(int *)(local_620.hit + 0x24);
                      iVar46 = *(int *)(local_620.hit + 0x28);
                      iVar47 = *(int *)(local_620.hit + 0x2c);
                      iVar48 = *(int *)(local_620.hit + 0x30);
                      iVar49 = *(int *)(local_620.hit + 0x34);
                      iVar50 = *(int *)(local_620.hit + 0x38);
                      iVar51 = *(int *)(local_620.hit + 0x3c);
                      bVar52 = (byte)uVar60;
                      bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
                      bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
                      bVar61 = (bool)((byte)(uVar60 >> 3) & 1);
                      bVar62 = (bool)((byte)(uVar60 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar60 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar60 >> 7) & 1);
                      bVar16 = (byte)(uVar60 >> 8);
                      bVar17 = (bool)((byte)(uVar60 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar60 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      bVar23 = SUB81(uVar60 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x300) =
                           (uint)(bVar52 & 1) * *(int *)local_620.hit |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x300);
                      *(uint *)(local_620.ray + 0x304) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x304);
                      *(uint *)(local_620.ray + 0x308) =
                           (uint)bVar64 * iVar38 | (uint)!bVar64 * *(int *)(local_620.ray + 0x308);
                      *(uint *)(local_620.ray + 0x30c) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x30c);
                      *(uint *)(local_620.ray + 0x310) =
                           (uint)bVar62 * iVar40 | (uint)!bVar62 * *(int *)(local_620.ray + 0x310);
                      *(uint *)(local_620.ray + 0x314) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x314);
                      *(uint *)(local_620.ray + 0x318) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x318);
                      *(uint *)(local_620.ray + 0x31c) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x31c);
                      *(uint *)(local_620.ray + 800) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 800);
                      *(uint *)(local_620.ray + 0x324) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x324);
                      *(uint *)(local_620.ray + 0x328) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x328);
                      *(uint *)(local_620.ray + 0x32c) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x32c);
                      *(uint *)(local_620.ray + 0x330) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x330);
                      *(uint *)(local_620.ray + 0x334) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x334);
                      *(uint *)(local_620.ray + 0x338) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x338);
                      *(uint *)(local_620.ray + 0x33c) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x33c);
                      iVar37 = *(int *)(local_620.hit + 0x44);
                      iVar38 = *(int *)(local_620.hit + 0x48);
                      iVar39 = *(int *)(local_620.hit + 0x4c);
                      iVar40 = *(int *)(local_620.hit + 0x50);
                      iVar41 = *(int *)(local_620.hit + 0x54);
                      iVar42 = *(int *)(local_620.hit + 0x58);
                      iVar43 = *(int *)(local_620.hit + 0x5c);
                      iVar44 = *(int *)(local_620.hit + 0x60);
                      iVar45 = *(int *)(local_620.hit + 100);
                      iVar46 = *(int *)(local_620.hit + 0x68);
                      iVar47 = *(int *)(local_620.hit + 0x6c);
                      iVar48 = *(int *)(local_620.hit + 0x70);
                      iVar49 = *(int *)(local_620.hit + 0x74);
                      iVar50 = *(int *)(local_620.hit + 0x78);
                      iVar51 = *(int *)(local_620.hit + 0x7c);
                      bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
                      bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
                      bVar61 = (bool)((byte)(uVar60 >> 3) & 1);
                      bVar62 = (bool)((byte)(uVar60 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar60 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar60 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar60 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar60 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      bVar23 = SUB81(uVar60 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x340) =
                           (uint)(bVar52 & 1) * *(int *)(local_620.hit + 0x40) |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x340);
                      *(uint *)(local_620.ray + 0x344) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x344);
                      *(uint *)(local_620.ray + 0x348) =
                           (uint)bVar64 * iVar38 | (uint)!bVar64 * *(int *)(local_620.ray + 0x348);
                      *(uint *)(local_620.ray + 0x34c) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x34c);
                      *(uint *)(local_620.ray + 0x350) =
                           (uint)bVar62 * iVar40 | (uint)!bVar62 * *(int *)(local_620.ray + 0x350);
                      *(uint *)(local_620.ray + 0x354) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x354);
                      *(uint *)(local_620.ray + 0x358) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x358);
                      *(uint *)(local_620.ray + 0x35c) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x35c);
                      *(uint *)(local_620.ray + 0x360) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 0x360);
                      *(uint *)(local_620.ray + 0x364) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x364);
                      *(uint *)(local_620.ray + 0x368) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x368);
                      *(uint *)(local_620.ray + 0x36c) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x36c);
                      *(uint *)(local_620.ray + 0x370) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x370);
                      *(uint *)(local_620.ray + 0x374) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x374);
                      *(uint *)(local_620.ray + 0x378) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x378);
                      *(uint *)(local_620.ray + 0x37c) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x37c);
                      iVar37 = *(int *)(local_620.hit + 0x84);
                      iVar38 = *(int *)(local_620.hit + 0x88);
                      iVar39 = *(int *)(local_620.hit + 0x8c);
                      iVar40 = *(int *)(local_620.hit + 0x90);
                      iVar41 = *(int *)(local_620.hit + 0x94);
                      iVar42 = *(int *)(local_620.hit + 0x98);
                      iVar43 = *(int *)(local_620.hit + 0x9c);
                      iVar44 = *(int *)(local_620.hit + 0xa0);
                      iVar45 = *(int *)(local_620.hit + 0xa4);
                      iVar46 = *(int *)(local_620.hit + 0xa8);
                      iVar47 = *(int *)(local_620.hit + 0xac);
                      iVar48 = *(int *)(local_620.hit + 0xb0);
                      iVar49 = *(int *)(local_620.hit + 0xb4);
                      iVar50 = *(int *)(local_620.hit + 0xb8);
                      iVar51 = *(int *)(local_620.hit + 0xbc);
                      bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
                      bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
                      bVar61 = (bool)((byte)(uVar60 >> 3) & 1);
                      bVar62 = (bool)((byte)(uVar60 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar60 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar60 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar60 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar60 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      bVar23 = SUB81(uVar60 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x380) =
                           (uint)(bVar52 & 1) * *(int *)(local_620.hit + 0x80) |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x380);
                      *(uint *)(local_620.ray + 900) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 900);
                      *(uint *)(local_620.ray + 0x388) =
                           (uint)bVar64 * iVar38 | (uint)!bVar64 * *(int *)(local_620.ray + 0x388);
                      *(uint *)(local_620.ray + 0x38c) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x38c);
                      *(uint *)(local_620.ray + 0x390) =
                           (uint)bVar62 * iVar40 | (uint)!bVar62 * *(int *)(local_620.ray + 0x390);
                      *(uint *)(local_620.ray + 0x394) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x394);
                      *(uint *)(local_620.ray + 0x398) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x398);
                      *(uint *)(local_620.ray + 0x39c) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x39c);
                      *(uint *)(local_620.ray + 0x3a0) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 0x3a0);
                      *(uint *)(local_620.ray + 0x3a4) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3a4);
                      *(uint *)(local_620.ray + 0x3a8) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x3a8);
                      *(uint *)(local_620.ray + 0x3ac) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3ac);
                      *(uint *)(local_620.ray + 0x3b0) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x3b0);
                      *(uint *)(local_620.ray + 0x3b4) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x3b4);
                      *(uint *)(local_620.ray + 0x3b8) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x3b8);
                      *(uint *)(local_620.ray + 0x3bc) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x3bc);
                      iVar37 = *(int *)(local_620.hit + 0xc4);
                      iVar38 = *(int *)(local_620.hit + 200);
                      iVar39 = *(int *)(local_620.hit + 0xcc);
                      iVar40 = *(int *)(local_620.hit + 0xd0);
                      iVar41 = *(int *)(local_620.hit + 0xd4);
                      iVar42 = *(int *)(local_620.hit + 0xd8);
                      iVar43 = *(int *)(local_620.hit + 0xdc);
                      iVar44 = *(int *)(local_620.hit + 0xe0);
                      iVar45 = *(int *)(local_620.hit + 0xe4);
                      iVar46 = *(int *)(local_620.hit + 0xe8);
                      iVar47 = *(int *)(local_620.hit + 0xec);
                      iVar48 = *(int *)(local_620.hit + 0xf0);
                      iVar49 = *(int *)(local_620.hit + 0xf4);
                      iVar50 = *(int *)(local_620.hit + 0xf8);
                      iVar51 = *(int *)(local_620.hit + 0xfc);
                      bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
                      bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
                      bVar61 = (bool)((byte)(uVar60 >> 3) & 1);
                      bVar62 = (bool)((byte)(uVar60 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar60 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar60 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar60 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar60 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      bVar23 = SUB81(uVar60 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x3c0) =
                           (uint)(bVar52 & 1) * *(int *)(local_620.hit + 0xc0) |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x3c0);
                      *(uint *)(local_620.ray + 0x3c4) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x3c4);
                      *(uint *)(local_620.ray + 0x3c8) =
                           (uint)bVar64 * iVar38 | (uint)!bVar64 * *(int *)(local_620.ray + 0x3c8);
                      *(uint *)(local_620.ray + 0x3cc) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x3cc);
                      *(uint *)(local_620.ray + 0x3d0) =
                           (uint)bVar62 * iVar40 | (uint)!bVar62 * *(int *)(local_620.ray + 0x3d0);
                      *(uint *)(local_620.ray + 0x3d4) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x3d4);
                      *(uint *)(local_620.ray + 0x3d8) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x3d8);
                      *(uint *)(local_620.ray + 0x3dc) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x3dc);
                      *(uint *)(local_620.ray + 0x3e0) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 0x3e0);
                      *(uint *)(local_620.ray + 0x3e4) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3e4);
                      *(uint *)(local_620.ray + 1000) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 1000);
                      *(uint *)(local_620.ray + 0x3ec) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3ec);
                      *(uint *)(local_620.ray + 0x3f0) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x3f0);
                      *(uint *)(local_620.ray + 0x3f4) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x3f4);
                      *(uint *)(local_620.ray + 0x3f8) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x3f8);
                      *(uint *)(local_620.ray + 0x3fc) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x3fc);
                      iVar37 = *(int *)(local_620.hit + 0x104);
                      iVar38 = *(int *)(local_620.hit + 0x108);
                      iVar39 = *(int *)(local_620.hit + 0x10c);
                      iVar40 = *(int *)(local_620.hit + 0x110);
                      iVar41 = *(int *)(local_620.hit + 0x114);
                      iVar42 = *(int *)(local_620.hit + 0x118);
                      iVar43 = *(int *)(local_620.hit + 0x11c);
                      iVar44 = *(int *)(local_620.hit + 0x120);
                      iVar45 = *(int *)(local_620.hit + 0x124);
                      iVar46 = *(int *)(local_620.hit + 0x128);
                      iVar47 = *(int *)(local_620.hit + 300);
                      iVar48 = *(int *)(local_620.hit + 0x130);
                      iVar49 = *(int *)(local_620.hit + 0x134);
                      iVar50 = *(int *)(local_620.hit + 0x138);
                      iVar51 = *(int *)(local_620.hit + 0x13c);
                      bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
                      bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
                      bVar61 = (bool)((byte)(uVar60 >> 3) & 1);
                      bVar62 = (bool)((byte)(uVar60 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar60 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar60 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar60 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar60 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      bVar23 = SUB81(uVar60 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x400) =
                           (uint)(bVar52 & 1) * *(int *)(local_620.hit + 0x100) |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x400);
                      *(uint *)(local_620.ray + 0x404) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x404);
                      *(uint *)(local_620.ray + 0x408) =
                           (uint)bVar64 * iVar38 | (uint)!bVar64 * *(int *)(local_620.ray + 0x408);
                      *(uint *)(local_620.ray + 0x40c) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x40c);
                      *(uint *)(local_620.ray + 0x410) =
                           (uint)bVar62 * iVar40 | (uint)!bVar62 * *(int *)(local_620.ray + 0x410);
                      *(uint *)(local_620.ray + 0x414) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x414);
                      *(uint *)(local_620.ray + 0x418) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x418);
                      *(uint *)(local_620.ray + 0x41c) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x41c);
                      *(uint *)(local_620.ray + 0x420) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 0x420);
                      *(uint *)(local_620.ray + 0x424) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x424);
                      *(uint *)(local_620.ray + 0x428) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x428);
                      *(uint *)(local_620.ray + 0x42c) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x42c);
                      *(uint *)(local_620.ray + 0x430) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x430);
                      *(uint *)(local_620.ray + 0x434) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x434);
                      *(uint *)(local_620.ray + 0x438) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x438);
                      *(uint *)(local_620.ray + 0x43c) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x43c);
                      auVar126 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x140));
                      auVar126 = vmovdqu32_avx512f(auVar126);
                      *(undefined1 (*) [64])(local_620.ray + 0x440) = auVar126;
                      auVar126 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x180));
                      auVar126 = vmovdqu32_avx512f(auVar126);
                      *(undefined1 (*) [64])(local_620.ray + 0x480) = auVar126;
                      auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x1c0));
                      auVar126 = vmovdqa32_avx512f(auVar127);
                      *(undefined1 (*) [64])(local_620.ray + 0x4c0) = auVar126;
                      auVar126 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x200));
                      bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
                      auVar36._4_56_ = auVar126._8_56_;
                      auVar36._0_4_ = (uint)bVar63 * auVar126._4_4_ | (uint)!bVar63 * auVar127._4_4_
                      ;
                      auVar128._0_8_ = auVar36._0_8_ << 0x20;
                      bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
                      auVar128._8_4_ =
                           (uint)bVar63 * auVar126._8_4_ | (uint)!bVar63 * auVar127._8_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
                      auVar128._12_4_ =
                           (uint)bVar63 * auVar126._12_4_ | (uint)!bVar63 * auVar127._12_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 4) & 1);
                      auVar128._16_4_ =
                           (uint)bVar63 * auVar126._16_4_ | (uint)!bVar63 * auVar127._16_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 5) & 1);
                      auVar128._20_4_ =
                           (uint)bVar63 * auVar126._20_4_ | (uint)!bVar63 * auVar127._20_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 6) & 1);
                      auVar128._24_4_ =
                           (uint)bVar63 * auVar126._24_4_ | (uint)!bVar63 * auVar127._24_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 7) & 1);
                      auVar128._28_4_ =
                           (uint)bVar63 * auVar126._28_4_ | (uint)!bVar63 * auVar127._28_4_;
                      auVar128._32_4_ =
                           (uint)(bVar16 & 1) * auVar126._32_4_ |
                           (uint)!(bool)(bVar16 & 1) * auVar127._32_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 9) & 1);
                      auVar128._36_4_ =
                           (uint)bVar63 * auVar126._36_4_ | (uint)!bVar63 * auVar127._36_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 10) & 1);
                      auVar128._40_4_ =
                           (uint)bVar63 * auVar126._40_4_ | (uint)!bVar63 * auVar127._40_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      auVar128._44_4_ =
                           (uint)bVar63 * auVar126._44_4_ | (uint)!bVar63 * auVar127._44_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      auVar128._48_4_ =
                           (uint)bVar63 * auVar126._48_4_ | (uint)!bVar63 * auVar127._48_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      auVar128._52_4_ =
                           (uint)bVar63 * auVar126._52_4_ | (uint)!bVar63 * auVar127._52_4_;
                      bVar63 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      auVar128._56_4_ =
                           (uint)bVar63 * auVar126._56_4_ | (uint)!bVar63 * auVar127._56_4_;
                      bVar63 = SUB81(uVar60 >> 0xf,0);
                      auVar128._60_4_ =
                           (uint)bVar63 * auVar126._60_4_ | (uint)!bVar63 * auVar127._60_4_;
                      auVar126 = vmovdqa32_avx512f(auVar126);
                      *(undefined1 (*) [64])(local_620.ray + 0x500) = auVar126;
                      goto LAB_019ca9f4;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar242;
                }
              }
            }
          }
        }
      }
      goto LAB_019ca9f4;
    }
    auVar66 = vinsertps_avx(auVar80,auVar81,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }